

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int param_2,bool param_3)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *b;
  uint *puVar1;
  uint i;
  long *plVar2;
  pointer pnVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar5;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  type_conflict5 tVar7;
  bool bVar8;
  int iVar9;
  uint i_00;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  double *pdVar11;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined8 uVar12;
  long lVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  uint local_75c;
  cpp_dec_float<50U,_int,_void> local_748;
  SPxId enterId;
  cpp_dec_float<50U,_int,_void> local_708;
  cpp_dec_float<50U,_int,_void> local_6c8;
  cpp_dec_float<50U,_int,_void> *local_690;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_688;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_680;
  long local_678;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_670;
  cpp_dec_float<50U,_int,_void> local_668;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_628;
  double local_620;
  long *local_618;
  long *local_610;
  long local_608;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_600;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b8;
  long *local_580;
  long *local_578;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  degeneps;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_4f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_478;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minStability;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_408;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_388;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  cpp_dec_float<50U,_int,_void> local_208;
  cpp_dec_float<50U,_int,_void> local_1c8;
  cpp_dec_float<50U,_int,_void> local_188;
  cpp_dec_float<50U,_int,_void> local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  cmaxabs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rmaxabs;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  undefined8 uVar13;
  undefined8 uVar14;
  
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  local_668.fpclass = cpp_dec_float_finite;
  local_668.prec_elem = 10;
  local_668.data._M_elems[0] = 0;
  local_668.data._M_elems[1] = 0;
  local_668.data._M_elems[2] = 0;
  local_668.data._M_elems[3] = 0;
  local_668.data._M_elems[4] = 0;
  local_668.data._M_elems[5] = 0;
  local_668.data._M_elems[6] = 0;
  local_668.data._M_elems[7] = 0;
  local_668.data._M_elems[8] = 0;
  local_668.data._M_elems[9] = 0;
  local_668.exp = 0;
  local_668.neg = false;
  local_748.fpclass = cpp_dec_float_finite;
  local_748.prec_elem = 10;
  local_748.data._M_elems[0] = 0;
  local_748.data._M_elems[1] = 0;
  local_748.data._M_elems[2] = 0;
  local_748.data._M_elems[3] = 0;
  local_748.data._M_elems[4] = 0;
  local_748.data._M_elems[5] = 0;
  local_748.data._M_elems[6] = 0;
  local_748.data._M_elems[7] = 0;
  local_748.data._M_elems[8] = 0;
  local_748.data._M_elems[9] = 0;
  local_748.exp = 0;
  local_748.neg = false;
  local_708.fpclass = cpp_dec_float_finite;
  local_708.prec_elem = 10;
  local_708.data._M_elems[0] = 0;
  local_708.data._M_elems[1] = 0;
  local_708.data._M_elems[2] = 0;
  local_708.data._M_elems[3] = 0;
  local_708.data._M_elems[4] = 0;
  local_708.data._M_elems[5] = 0;
  local_708.data._M_elems._24_5_ = 0;
  local_708.data._M_elems[7]._1_3_ = 0;
  local_708.data._M_elems._32_5_ = 0;
  local_708.data._M_elems[9]._1_3_ = 0;
  local_708.exp = 0;
  local_708.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_4f8,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_6c8,0.0,(type *)0x0);
  local_478.m_backend.fpclass = cpp_dec_float_finite;
  local_478.m_backend.prec_elem = 10;
  local_478.m_backend.data._M_elems[0] = 0;
  local_478.m_backend.data._M_elems[1] = 0;
  local_478.m_backend.data._M_elems[2] = 0;
  local_478.m_backend.data._M_elems[3] = 0;
  local_478.m_backend.data._M_elems[4] = 0;
  local_478.m_backend.data._M_elems[5] = 0;
  local_478.m_backend.data._M_elems._24_5_ = 0;
  local_478.m_backend.data._M_elems[7]._1_3_ = 0;
  local_478.m_backend.data._M_elems._32_5_ = 0;
  local_478.m_backend.data._M_elems[9]._1_3_ = 0;
  local_478.m_backend.exp = 0;
  local_478.m_backend.neg = false;
  local_5b8.m_backend.fpclass = cpp_dec_float_finite;
  local_5b8.m_backend.prec_elem = 10;
  local_5b8.m_backend.data._M_elems[0] = 0;
  local_5b8.m_backend.data._M_elems[1] = 0;
  local_5b8.m_backend.data._M_elems[2] = 0;
  local_5b8.m_backend.data._M_elems[3] = 0;
  local_5b8.m_backend.data._M_elems[4] = 0;
  local_5b8.m_backend.data._M_elems[5] = 0;
  local_5b8.m_backend.data._M_elems._24_5_ = 0;
  local_5b8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_5b8.m_backend.data._M_elems._32_5_ = 0;
  local_5b8.m_backend.data._M_elems[9]._1_3_ = 0;
  local_5b8.m_backend.exp = 0;
  local_5b8.m_backend.neg = false;
  local_5f8.m_backend.fpclass = cpp_dec_float_finite;
  local_5f8.m_backend.prec_elem = 10;
  local_5f8.m_backend.data._M_elems[0] = 0;
  local_5f8.m_backend.data._M_elems[1] = 0;
  local_5f8.m_backend.data._M_elems[2] = 0;
  local_5f8.m_backend.data._M_elems[3] = 0;
  local_5f8.m_backend.data._M_elems[4] = 0;
  local_5f8.m_backend.data._M_elems[5] = 0;
  local_5f8.m_backend.data._M_elems._24_5_ = 0;
  local_5f8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_5f8.m_backend.data._M_elems._32_5_ = 0;
  local_5f8.m_backend.data._M_elems[9]._1_3_ = 0;
  local_5f8.m_backend.exp = 0;
  local_5f8.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&cmaxabs.m_backend,1,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&rmaxabs.m_backend,1,(type *)0x0);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&epsilon,
             &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar18 = -(ulong)(*(double *)(epsilon.m_backend.data._M_elems._0_8_ + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&minStability.m_backend,
             (double)(~uVar18 & (ulong)(*(double *)(epsilon.m_backend.data._M_elems._0_8_ + 0x40) *
                                       0.0001) | uVar18 & 0x3f1a36e2eb1c432d),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(epsilon.m_backend.data._M_elems + 2));
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::epsilon(&epsilon,(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(extraout_var,iVar9));
  degenerateEps(&degeneps,this);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  plVar2 = *(long **)(CONCAT44(extraout_var_00,iVar9) + 0xa60);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_678 = *(long *)(CONCAT44(extraout_var_01,iVar9) + 0xa60);
  local_670 = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)(local_678 + 0x50);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_680 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                **)(CONCAT44(extraout_var_02,iVar9) + 0xa58);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_608 = *(long *)(CONCAT44(extraout_var_03,iVar9) + 0xa58);
  local_600 = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)(local_608 + 0x50);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_610 = *(long **)(CONCAT44(extraout_var_04,iVar9) + 0xa78);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_618 = *(long **)(CONCAT44(extraout_var_05,iVar9) + 0xa80);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_578 = *(long **)(CONCAT44(extraout_var_06,iVar9) + 0xa88);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_580 = *(long **)(CONCAT44(extraout_var_07,iVar9) + 0xa90);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_08,iVar9) + 0xa58) + 0x50));
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_09,iVar9) + 0xa60) + 0x50));
  tVar7 = boost::multiprecision::operator>(val,&epsilon);
  local_690 = &val->m_backend;
  if (tVar7) {
    b = &(this->
         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).delta;
LAB_0023e1c4:
    do {
      while( true ) {
        do {
          local_4f8.data._M_elems._32_8_ =
               *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 8);
          local_4f8.data._M_elems._0_8_ =
               *(undefined8 *)
                (((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems;
          local_4f8.data._M_elems._8_8_ =
               *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 2);
          local_4f8.data._M_elems[4] =
               (((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems[4];
          local_4f8.data._M_elems[5] =
               (((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems[5];
          local_4f8.data._M_elems[6] =
               (((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems[6];
          local_4f8.data._M_elems[7] =
               (((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems[7];
          local_4f8.exp = (val->m_backend).exp;
          local_4f8.neg = (val->m_backend).neg;
          local_4f8.fpclass = (val->m_backend).fpclass;
          local_4f8.prec_elem = (val->m_backend).prec_elem;
          iVar9 = (*(this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SPxRatioTester[3])(this);
          (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar9) + 0x368))
                    (&result_1,(long *)CONCAT44(extraout_var_10,iVar9));
          local_478.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_478.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_478.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_478.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_478.m_backend.data._M_elems._24_5_ =
               SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],
                              result_1.m_backend.data._M_elems[6]),0);
          local_478.m_backend.data._M_elems[7]._1_3_ =
               (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
          local_478.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_478.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_478.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_478.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_478.m_backend.exp = result_1.m_backend.exp;
          local_478.m_backend.neg = result_1.m_backend.neg;
          local_478.m_backend.fpclass = result_1.m_backend.fpclass;
          local_478.m_backend.prec_elem = result_1.m_backend.prec_elem;
          maxDelta(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&rmaxabs.m_backend,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_4f8,*(int *)(local_678 + 0x58),*(int **)(local_678 + 0x60),
                   *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     **)(local_678 + 0x70),
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*plVar2,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*local_618,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*local_610);
          maxDelta(this,&cmaxabs,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_4f8,*(int *)(local_608 + 0x58),*(int **)(local_608 + 0x60),
                   *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     **)(local_608 + 0x70),
                   (local_680->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*local_580,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*local_578);
          bVar8 = boost::multiprecision::operator==
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_4f8,val);
          if (bVar8) {
            uVar14._0_4_ = enterId.super_DataKey.info;
            uVar14._4_4_ = enterId.super_DataKey.idx;
            return (SPxId)uVar14;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_668,0);
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result_1.m_backend,-*pdVar11,(type *)0x0);
          local_6c8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_6c8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_6c8.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
          local_6c8.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
          local_6c8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_6c8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_6c8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_6c8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_6c8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_6c8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_6c8.exp = result_1.m_backend.exp;
          local_6c8.neg = result_1.m_backend.neg;
          local_6c8.fpclass = result_1.m_backend.fpclass;
          local_6c8.prec_elem = result_1.m_backend.prec_elem;
          local_620 = 0.001;
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems._24_5_ = 0;
          result.m_backend.data._M_elems[7]._1_3_ = 0;
          result.m_backend.data._M_elems._32_5_ = 0;
          result.m_backend.data._M_elems[9]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                    (&result.m_backend,&rmaxabs.m_backend,&local_620);
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend.data._M_elems[9]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1.m_backend,&result.m_backend,&epsilon.m_backend);
          local_5f8.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_5f8.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_5f8.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_5f8.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_5f8.m_backend.data._M_elems._24_5_ =
               SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],
                              result_1.m_backend.data._M_elems[6]),0);
          local_5f8.m_backend.data._M_elems[7]._1_3_ =
               (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
          local_5f8.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_5f8.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_5f8.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_5f8.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_5f8.m_backend.exp = result_1.m_backend.exp;
          local_5f8.m_backend.neg = result_1.m_backend.neg;
          local_5f8.m_backend.fpclass = result_1.m_backend.fpclass;
          local_5f8.m_backend.prec_elem = result_1.m_backend.prec_elem;
          tVar7 = boost::multiprecision::operator<
                            (&local_5f8,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&epsilon.m_backend);
          if (tVar7) {
            local_5f8.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
            local_5f8.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
            local_5f8.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
            local_5f8.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
            local_5f8.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
            local_5f8.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
            local_5f8.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
            local_5f8.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
            local_5f8.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
            local_5f8.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
            local_5f8.m_backend.exp = epsilon.m_backend.exp;
            local_5f8.m_backend.neg = epsilon.m_backend.neg;
            local_5f8.m_backend.fpclass = epsilon.m_backend.fpclass;
            local_5f8.m_backend.prec_elem = epsilon.m_backend.prec_elem;
          }
          local_620 = 0.001;
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems._24_5_ = 0;
          result.m_backend.data._M_elems[7]._1_3_ = 0;
          result.m_backend.data._M_elems._32_5_ = 0;
          result.m_backend.data._M_elems[9]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                    (&result.m_backend,&cmaxabs.m_backend,&local_620);
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend.data._M_elems[9]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1.m_backend,&result.m_backend,&epsilon.m_backend);
          local_5b8.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_5b8.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_5b8.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_5b8.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_5b8.m_backend.data._M_elems._24_5_ =
               SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],
                              result_1.m_backend.data._M_elems[6]),0);
          local_5b8.m_backend.data._M_elems[7]._1_3_ =
               (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
          local_5b8.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_5b8.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_5b8.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_5b8.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_5b8.m_backend.exp = result_1.m_backend.exp;
          local_5b8.m_backend.neg = result_1.m_backend.neg;
          local_5b8.m_backend.fpclass = result_1.m_backend.fpclass;
          local_5b8.m_backend.prec_elem = result_1.m_backend.prec_elem;
          tVar7 = boost::multiprecision::operator<
                            (&local_5b8,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&epsilon.m_backend);
          if (tVar7) {
            local_5b8.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
            local_5b8.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
            local_5b8.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
            local_5b8.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
            local_5b8.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
            local_5b8.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
            local_5b8.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
            local_5b8.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
            local_5b8.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
            local_5b8.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
            local_5b8.m_backend.exp = epsilon.m_backend.exp;
            local_5b8.m_backend.neg = epsilon.m_backend.neg;
            local_5b8.m_backend.fpclass = epsilon.m_backend.fpclass;
            local_5b8.m_backend.prec_elem = epsilon.m_backend.prec_elem;
          }
          uVar17 = *(uint *)(local_678 + 0x58);
          lVar16 = local_678;
          i_00 = 0xffffffff;
          while (0 < (int)uVar17) {
            uVar17 = uVar17 - 1;
            i = *(uint *)(*(long *)(lVar16 + 0x60) + (ulong)uVar17 * 4);
            SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[](&result_1,local_670,i);
            local_748.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
            local_748.data._M_elems[9] =
                 (uint)(CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                                 result_1.m_backend.data._M_elems._32_5_) >> 0x20);
            local_748.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
            local_748.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
            local_748.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
            local_748.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
            local_748.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
            local_748.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
            local_748.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
            local_748.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
            local_748.exp = result_1.m_backend.exp;
            local_748.neg = result_1.m_backend.neg;
            local_748.fpclass = result_1.m_backend.fpclass;
            local_748.prec_elem = result_1.m_backend.prec_elem;
            tVar7 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_748,&local_5f8);
            if (tVar7) {
              lVar15 = (long)(int)i * 0x38;
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems._32_5_ = 0;
              result_1.m_backend.data._M_elems[9]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)(*local_610 + lVar15),
                         (cpp_dec_float<50U,_int,_void> *)(*plVar2 + lVar15));
              local_708.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
              local_708.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
              local_708.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
              local_708.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
              local_708.data._M_elems._24_5_ =
                   SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],
                                  result_1.m_backend.data._M_elems[6]),0);
              local_708.data._M_elems[7]._1_3_ =
                   (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
              local_708.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
              local_708.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
              local_708.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
              local_708.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
              local_708.exp = result_1.m_backend.exp;
              local_708.neg = result_1.m_backend.neg;
              local_708.fpclass = result_1.m_backend.fpclass;
              local_708.prec_elem = result_1.m_backend.prec_elem;
              result_1.m_backend.data._M_elems._32_5_ = degeneps.m_backend.data._M_elems._32_5_;
              result_1.m_backend.data._M_elems[9]._1_3_ = degeneps.m_backend.data._M_elems[9]._1_3_;
              result_1.m_backend.data._M_elems[4] = degeneps.m_backend.data._M_elems[4];
              result_1.m_backend.data._M_elems[5] = degeneps.m_backend.data._M_elems[5];
              result_1.m_backend.data._M_elems[6] = degeneps.m_backend.data._M_elems[6];
              result_1.m_backend.data._M_elems[7] = degeneps.m_backend.data._M_elems[7];
              result_1.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
              result_1.m_backend.data._M_elems[1] = degeneps.m_backend.data._M_elems[1];
              uVar12 = result_1.m_backend.data._M_elems._0_8_;
              result_1.m_backend.data._M_elems[2] = degeneps.m_backend.data._M_elems[2];
              result_1.m_backend.data._M_elems[3] = degeneps.m_backend.data._M_elems[3];
              result_1.m_backend.exp = degeneps.m_backend.exp;
              result_1.m_backend.neg = degeneps.m_backend.neg;
              result_1.m_backend.fpclass = degeneps.m_backend.fpclass;
              result_1.m_backend.prec_elem = degeneps.m_backend.prec_elem;
              result_1.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
              if (degeneps.m_backend.fpclass != cpp_dec_float_finite ||
                  result_1.m_backend.data._M_elems[0] != 0) {
                result_1.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
              }
              result_1.m_backend.data._M_elems._0_8_ = uVar12;
              tVar7 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_708,&result_1);
              if (tVar7) {
                iVar9 = (*(this->
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          )._vptr_SPxRatioTester[3])();
                local_148.fpclass = cpp_dec_float_finite;
                local_148.prec_elem = 10;
                local_148.data._M_elems._32_5_ = 0;
                local_148._37_8_ = 0;
                local_148.data._M_elems[4] = 0;
                local_148.data._M_elems[5] = 0;
                local_148.data._M_elems._24_5_ = 0;
                local_148.data._M_elems[7]._1_3_ = 0;
                local_148.data._M_elems[0] = 0;
                local_148.data._M_elems[1] = 0;
                local_148.data._M_elems[2] = 0;
                local_148.data._M_elems[3] = 0;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (&local_148,(cpp_dec_float<50U,_int,_void> *)(lVar15 + *plVar2),
                           &degeneps.m_backend);
                SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_11,iVar9),i,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_148);
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                          (&local_708,&local_748);
                tVar7 = boost::multiprecision::operator<=
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_708,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_4f8);
                if ((tVar7) &&
                   (tVar7 = boost::multiprecision::operator>=
                                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_748,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_668), tVar7)) {
                  iVar9 = (*(this->
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._vptr_SPxRatioTester[3])();
                  enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_13,iVar9),i);
                  local_6c8.data._M_elems[0] = local_708.data._M_elems[0];
                  local_6c8.data._M_elems[1] = local_708.data._M_elems[1];
                  local_6c8.data._M_elems[2] = local_708.data._M_elems[2];
                  local_6c8.data._M_elems[3] = local_708.data._M_elems[3];
                  local_6c8.data._M_elems[4] = local_708.data._M_elems[4];
                  local_6c8.data._M_elems[5] = local_708.data._M_elems[5];
                  local_6c8.data._M_elems[7]._1_3_ = local_708.data._M_elems[7]._1_3_;
                  local_6c8.data._M_elems._24_5_ = local_708.data._M_elems._24_5_;
                  local_6c8.data._M_elems[9]._1_3_ = local_708.data._M_elems[9]._1_3_;
                  local_6c8.data._M_elems._32_5_ = local_708.data._M_elems._32_5_;
                  local_6c8.exp = local_708.exp;
                  local_6c8.neg = local_708.neg;
                  local_6c8.fpclass = local_708.fpclass;
                  local_6c8.prec_elem = local_708.prec_elem;
                  local_668.data._M_elems[0] = local_748.data._M_elems[0];
                  local_668.data._M_elems[1] = local_748.data._M_elems[1];
                  local_668.data._M_elems[2] = local_748.data._M_elems[2];
                  local_668.data._M_elems[3] = local_748.data._M_elems[3];
                  local_668.data._M_elems[4] = local_748.data._M_elems[4];
                  local_668.data._M_elems[5] = local_748.data._M_elems[5];
                  local_668.data._M_elems[6] = local_748.data._M_elems[6];
                  local_668.data._M_elems[7] = local_748.data._M_elems[7];
                  local_668.data._M_elems[8] = local_748.data._M_elems[8];
                  local_668.data._M_elems[9] = local_748.data._M_elems[9];
                  local_668.exp = local_748.exp;
                  local_668.neg = local_748.neg;
                  local_668.fpclass = local_748.fpclass;
                  local_668.prec_elem = local_748.prec_elem;
                  i_00 = i;
                }
              }
            }
            else {
              result_1.m_backend.data._M_elems[0] = local_5f8.m_backend.data._M_elems[0];
              result_1.m_backend.data._M_elems[1] = local_5f8.m_backend.data._M_elems[1];
              uVar12 = result_1.m_backend.data._M_elems._0_8_;
              result_1.m_backend.data._M_elems[2] = local_5f8.m_backend.data._M_elems[2];
              result_1.m_backend.data._M_elems[3] = local_5f8.m_backend.data._M_elems[3];
              result_1.m_backend.data._M_elems._32_5_ = local_5f8.m_backend.data._M_elems._32_5_;
              result_1.m_backend.data._M_elems[9]._1_3_ = local_5f8.m_backend.data._M_elems[9]._1_3_
              ;
              result_1.m_backend.data._M_elems[4] = local_5f8.m_backend.data._M_elems[4];
              result_1.m_backend.data._M_elems[5] = local_5f8.m_backend.data._M_elems[5];
              result_1.m_backend.data._M_elems[6] = local_5f8.m_backend.data._M_elems[6];
              result_1.m_backend.data._M_elems[7] =
                   (uint)(CONCAT35(local_5f8.m_backend.data._M_elems[7]._1_3_,
                                   local_5f8.m_backend.data._M_elems._24_5_) >> 0x20);
              result_1.m_backend.exp = local_5f8.m_backend.exp;
              result_1.m_backend.neg = local_5f8.m_backend.neg;
              result_1.m_backend.fpclass = local_5f8.m_backend.fpclass;
              result_1.m_backend.prec_elem = local_5f8.m_backend.prec_elem;
              result_1.m_backend.data._M_elems[0] = local_5f8.m_backend.data._M_elems[0];
              if (local_5f8.m_backend.fpclass != cpp_dec_float_finite ||
                  result_1.m_backend.data._M_elems[0] != 0) {
                result_1.m_backend.neg = (bool)(local_5f8.m_backend.neg ^ 1);
              }
              result_1.m_backend.data._M_elems._0_8_ = uVar12;
              tVar7 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_748,&result_1);
              pSVar6 = local_670;
              if (tVar7) {
                lVar16 = (long)(int)i * 0x38;
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 10;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems[6] = 0;
                result_1.m_backend.data._M_elems[7] = 0;
                result_1.m_backend.data._M_elems._32_5_ = 0;
                result_1.m_backend.data._M_elems[9]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (&result_1.m_backend,
                           (cpp_dec_float<50U,_int,_void> *)(*local_618 + lVar16),
                           (cpp_dec_float<50U,_int,_void> *)(*plVar2 + lVar16));
                local_708.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
                local_708.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
                local_708.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
                local_708.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
                local_708.data._M_elems._24_5_ =
                     SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],
                                    result_1.m_backend.data._M_elems[6]),0);
                local_708.data._M_elems[7]._1_3_ =
                     (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
                local_708.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
                local_708.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
                local_708.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
                local_708.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
                local_708.exp = result_1.m_backend.exp;
                local_708.neg = result_1.m_backend.neg;
                local_708.fpclass = result_1.m_backend.fpclass;
                local_708.prec_elem = result_1.m_backend.prec_elem;
                tVar7 = boost::multiprecision::operator>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_708,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&degeneps.m_backend);
                if (tVar7) {
                  iVar9 = (*(this->
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._vptr_SPxRatioTester[3])();
                  local_188.fpclass = cpp_dec_float_finite;
                  local_188.prec_elem = 10;
                  local_188.data._M_elems._32_5_ = 0;
                  local_188._37_8_ = 0;
                  local_188.data._M_elems[4] = 0;
                  local_188.data._M_elems[5] = 0;
                  local_188.data._M_elems._24_5_ = 0;
                  local_188.data._M_elems[7]._1_3_ = 0;
                  local_188.data._M_elems[0] = 0;
                  local_188.data._M_elems[1] = 0;
                  local_188.data._M_elems[2] = 0;
                  local_188.data._M_elems[3] = 0;
                  boost::multiprecision::default_ops::
                  eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            (&local_188,(cpp_dec_float<50U,_int,_void> *)(lVar16 + *plVar2),
                             &degeneps.m_backend);
                  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_12,iVar9),i,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_188);
                  lVar16 = local_678;
                }
                else {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                            (&local_708,&local_748);
                  tVar7 = boost::multiprecision::operator<=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_708,
                                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_4f8);
                  lVar16 = local_678;
                  if (tVar7) {
                    result_1.m_backend.data._M_elems[1] = local_748.data._M_elems[1];
                    result_1.m_backend.data._M_elems[0] = local_748.data._M_elems[0];
                    result_1.m_backend.data._M_elems[3] = local_748.data._M_elems[3];
                    result_1.m_backend.data._M_elems[2] = local_748.data._M_elems[2];
                    result_1.m_backend.data._M_elems[5] = local_748.data._M_elems[5];
                    result_1.m_backend.data._M_elems[4] = local_748.data._M_elems[4];
                    result_1.m_backend.data._M_elems._32_5_ =
                         SUB85(CONCAT44(local_748.data._M_elems[9],local_748.data._M_elems[8]),0);
                    result_1.m_backend.data._M_elems[9]._1_3_ =
                         (undefined3)(local_748.data._M_elems[9] >> 8);
                    result_1.m_backend.data._M_elems[6] = local_748.data._M_elems[6];
                    result_1.m_backend.data._M_elems[7] = local_748.data._M_elems[7];
                    result_1.m_backend.exp = local_748.exp;
                    result_1.m_backend.neg = local_748.neg;
                    result_1.m_backend.fpclass = local_748.fpclass;
                    result_1.m_backend.prec_elem = local_748.prec_elem;
                    if (local_748.fpclass != cpp_dec_float_finite || local_748.data._M_elems[0] != 0
                       ) {
                      result_1.m_backend.neg = (bool)(local_748.neg ^ 1);
                    }
                    tVar7 = boost::multiprecision::operator>=
                                      (&result_1,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_668);
                    if (tVar7) {
                      iVar9 = (*(this->
                                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._vptr_SPxRatioTester[3])();
                      enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(extraout_var_14,iVar9),i);
                      local_6c8.data._M_elems[7]._1_3_ = local_708.data._M_elems[7]._1_3_;
                      local_6c8.data._M_elems._24_5_ = local_708.data._M_elems._24_5_;
                      local_6c8.data._M_elems[0] = local_708.data._M_elems[0];
                      local_6c8.data._M_elems[1] = local_708.data._M_elems[1];
                      local_6c8.data._M_elems[2] = local_708.data._M_elems[2];
                      local_6c8.data._M_elems[3] = local_708.data._M_elems[3];
                      local_6c8.data._M_elems[4] = local_708.data._M_elems[4];
                      local_6c8.data._M_elems[5] = local_708.data._M_elems[5];
                      local_6c8.data._M_elems[9]._1_3_ = local_708.data._M_elems[9]._1_3_;
                      local_6c8.data._M_elems._32_5_ = local_708.data._M_elems._32_5_;
                      local_6c8.exp = local_708.exp;
                      local_6c8.neg = local_708.neg;
                      local_6c8.fpclass = local_708.fpclass;
                      local_6c8.prec_elem = local_708.prec_elem;
                      local_668.data._M_elems[0] = local_748.data._M_elems[0];
                      local_668.data._M_elems[9] = local_748.data._M_elems[9];
                      local_668.data._M_elems[5] = local_748.data._M_elems[5];
                      local_668.data._M_elems[6] = local_748.data._M_elems[6];
                      local_668.data._M_elems[7] = local_748.data._M_elems[7];
                      local_668.data._M_elems[8] = local_748.data._M_elems[8];
                      local_668.data._M_elems[1] = local_748.data._M_elems[1];
                      local_668.data._M_elems[2] = local_748.data._M_elems[2];
                      local_668.data._M_elems[3] = local_748.data._M_elems[3];
                      local_668.data._M_elems[4] = local_748.data._M_elems[4];
                      local_668.exp = local_748.exp;
                      local_668.neg =
                           (bool)((local_748.data._M_elems[0] != 0 ||
                                  local_748.fpclass != cpp_dec_float_finite) ^ local_748.neg);
                      local_668.fpclass = local_748.fpclass;
                      local_668.prec_elem = local_748.prec_elem;
                      i_00 = i;
                    }
                  }
                }
              }
              else {
                SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[](&result_1,local_670,i);
                SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::clearNum(pSVar6,uVar17);
              }
            }
          }
          uVar17 = *(uint *)(local_608 + 0x58);
          local_628 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)CONCAT44(local_628._4_4_,0xffffffff);
          while( true ) {
            if ((int)uVar17 < 1) break;
            uVar17 = uVar17 - 1;
            iVar9 = *(int *)(*(long *)(local_608 + 0x60) + (ulong)uVar17 * 4);
            lVar16 = (long)iVar9;
            SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[](&result_1,local_600,iVar9);
            local_748.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
            local_748.data._M_elems[9] =
                 (uint)(CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                                 result_1.m_backend.data._M_elems._32_5_) >> 0x20);
            local_748.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
            local_748.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
            local_748.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
            local_748.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
            local_748.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
            local_748.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
            local_748.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
            local_748.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
            local_748.exp = result_1.m_backend.exp;
            local_748.neg = result_1.m_backend.neg;
            local_748.fpclass = result_1.m_backend.fpclass;
            local_748.prec_elem = result_1.m_backend.prec_elem;
            tVar7 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_748,&local_5b8);
            pVVar5 = local_680;
            if (tVar7) {
              local_688 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(local_688._4_4_,iVar9);
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems._32_5_ = 0;
              result_1.m_backend.data._M_elems[9]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result_1.m_backend,
                         (cpp_dec_float<50U,_int,_void> *)(*local_578 + lVar16 * 0x38),
                         &(local_680->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar16].m_backend);
              local_708.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
              local_708.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
              local_708.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
              local_708.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
              local_708.data._M_elems._24_5_ =
                   SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],
                                  result_1.m_backend.data._M_elems[6]),0);
              local_708.data._M_elems[7]._1_3_ =
                   (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
              local_708.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
              local_708.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
              local_708.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
              local_708.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
              local_708.exp = result_1.m_backend.exp;
              local_708.neg = result_1.m_backend.neg;
              local_708.fpclass = result_1.m_backend.fpclass;
              local_708.prec_elem = result_1.m_backend.prec_elem;
              result_1.m_backend.data._M_elems._32_5_ = degeneps.m_backend.data._M_elems._32_5_;
              result_1.m_backend.data._M_elems[9]._1_3_ = degeneps.m_backend.data._M_elems[9]._1_3_;
              result_1.m_backend.data._M_elems[4] = degeneps.m_backend.data._M_elems[4];
              result_1.m_backend.data._M_elems[5] = degeneps.m_backend.data._M_elems[5];
              result_1.m_backend.data._M_elems[6] = degeneps.m_backend.data._M_elems[6];
              result_1.m_backend.data._M_elems[7] = degeneps.m_backend.data._M_elems[7];
              result_1.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
              result_1.m_backend.data._M_elems[1] = degeneps.m_backend.data._M_elems[1];
              uVar12 = result_1.m_backend.data._M_elems._0_8_;
              result_1.m_backend.data._M_elems[2] = degeneps.m_backend.data._M_elems[2];
              result_1.m_backend.data._M_elems[3] = degeneps.m_backend.data._M_elems[3];
              result_1.m_backend.exp = degeneps.m_backend.exp;
              result_1.m_backend.neg = degeneps.m_backend.neg;
              result_1.m_backend.fpclass = degeneps.m_backend.fpclass;
              result_1.m_backend.prec_elem = degeneps.m_backend.prec_elem;
              result_1.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
              if (degeneps.m_backend.fpclass != cpp_dec_float_finite ||
                  result_1.m_backend.data._M_elems[0] != 0) {
                result_1.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
              }
              result_1.m_backend.data._M_elems._0_8_ = uVar12;
              tVar7 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_708,&result_1);
              if (tVar7) {
                iVar9 = (*(this->
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          )._vptr_SPxRatioTester[3])();
                local_1c8.fpclass = cpp_dec_float_finite;
                local_1c8.prec_elem = 10;
                local_1c8.data._M_elems._32_5_ = 0;
                local_1c8._37_8_ = 0;
                local_1c8.data._M_elems[4] = 0;
                local_1c8.data._M_elems[5] = 0;
                local_1c8.data._M_elems._24_5_ = 0;
                local_1c8.data._M_elems[7]._1_3_ = 0;
                local_1c8.data._M_elems[0] = 0;
                local_1c8.data._M_elems[1] = 0;
                local_1c8.data._M_elems[2] = 0;
                local_1c8.data._M_elems[3] = 0;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (&local_1c8,
                           &(pVVar5->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar16].m_backend,
                           &degeneps.m_backend);
                SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::shiftUCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_15,iVar9),(int)local_688,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_1c8);
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                          (&local_708,&local_748);
                tVar7 = boost::multiprecision::operator<=
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_708,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_4f8);
                if (tVar7) {
                  tVar7 = boost::multiprecision::operator>=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_748,
                                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_668);
                  iVar9 = (int)local_688;
                  if (tVar7) {
                    iVar10 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(extraout_var_17,iVar10),iVar9);
                    local_6c8.data._M_elems[0] = local_708.data._M_elems[0];
                    local_6c8.data._M_elems[1] = local_708.data._M_elems[1];
                    local_6c8.data._M_elems[2] = local_708.data._M_elems[2];
                    local_6c8.data._M_elems[3] = local_708.data._M_elems[3];
                    local_6c8.data._M_elems[4] = local_708.data._M_elems[4];
                    local_6c8.data._M_elems[5] = local_708.data._M_elems[5];
                    local_6c8.data._M_elems[7]._1_3_ = local_708.data._M_elems[7]._1_3_;
                    local_6c8.data._M_elems._24_5_ = local_708.data._M_elems._24_5_;
                    local_6c8.data._M_elems[9]._1_3_ = local_708.data._M_elems[9]._1_3_;
                    local_6c8.data._M_elems._32_5_ = local_708.data._M_elems._32_5_;
                    local_6c8.exp = local_708.exp;
                    local_6c8.neg = local_708.neg;
                    local_6c8.fpclass = local_708.fpclass;
                    local_6c8.prec_elem = local_708.prec_elem;
                    local_668.data._M_elems[0] = local_748.data._M_elems[0];
                    local_668.data._M_elems[1] = local_748.data._M_elems[1];
                    local_668.data._M_elems[2] = local_748.data._M_elems[2];
                    local_668.data._M_elems[3] = local_748.data._M_elems[3];
                    local_668.data._M_elems[4] = local_748.data._M_elems[4];
                    local_668.data._M_elems[5] = local_748.data._M_elems[5];
                    local_668.data._M_elems[6] = local_748.data._M_elems[6];
                    local_668.data._M_elems[7] = local_748.data._M_elems[7];
                    local_668.data._M_elems[8] = local_748.data._M_elems[8];
                    local_668.data._M_elems[9] = local_748.data._M_elems[9];
                    local_668.exp = local_748.exp;
                    local_668.neg = local_748.neg;
                    local_668.fpclass = local_748.fpclass;
                    local_668.prec_elem = local_748.prec_elem;
                    local_628 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT44(local_628._4_4_,uVar17);
                  }
                }
              }
            }
            else {
              result_1.m_backend.data._M_elems[0] = local_5b8.m_backend.data._M_elems[0];
              result_1.m_backend.data._M_elems[1] = local_5b8.m_backend.data._M_elems[1];
              uVar12 = result_1.m_backend.data._M_elems._0_8_;
              result_1.m_backend.data._M_elems[2] = local_5b8.m_backend.data._M_elems[2];
              result_1.m_backend.data._M_elems[3] = local_5b8.m_backend.data._M_elems[3];
              result_1.m_backend.data._M_elems._32_5_ = local_5b8.m_backend.data._M_elems._32_5_;
              result_1.m_backend.data._M_elems[9]._1_3_ = local_5b8.m_backend.data._M_elems[9]._1_3_
              ;
              result_1.m_backend.data._M_elems[4] = local_5b8.m_backend.data._M_elems[4];
              result_1.m_backend.data._M_elems[5] = local_5b8.m_backend.data._M_elems[5];
              result_1.m_backend.data._M_elems[6] = local_5b8.m_backend.data._M_elems[6];
              result_1.m_backend.data._M_elems[7] =
                   (uint)(CONCAT35(local_5b8.m_backend.data._M_elems[7]._1_3_,
                                   local_5b8.m_backend.data._M_elems._24_5_) >> 0x20);
              result_1.m_backend.exp = local_5b8.m_backend.exp;
              result_1.m_backend.neg = local_5b8.m_backend.neg;
              result_1.m_backend.fpclass = local_5b8.m_backend.fpclass;
              result_1.m_backend.prec_elem = local_5b8.m_backend.prec_elem;
              result_1.m_backend.data._M_elems[0] = local_5b8.m_backend.data._M_elems[0];
              if (local_5b8.m_backend.fpclass != cpp_dec_float_finite ||
                  result_1.m_backend.data._M_elems[0] != 0) {
                result_1.m_backend.neg = (bool)(local_5b8.m_backend.neg ^ 1);
              }
              result_1.m_backend.data._M_elems._0_8_ = uVar12;
              tVar7 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_748,&result_1);
              pSVar6 = local_600;
              pVVar5 = local_680;
              if (tVar7) {
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 10;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems[6] = 0;
                result_1.m_backend.data._M_elems[7] = 0;
                result_1.m_backend.data._M_elems._32_5_ = 0;
                result_1.m_backend.data._M_elems[9]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (&result_1.m_backend,
                           (cpp_dec_float<50U,_int,_void> *)(*local_580 + lVar16 * 0x38),
                           &(local_680->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar16].m_backend);
                local_708.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
                local_708.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
                local_708.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
                local_708.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
                local_708.data._M_elems._24_5_ =
                     SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],
                                    result_1.m_backend.data._M_elems[6]),0);
                local_708.data._M_elems[7]._1_3_ =
                     (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
                local_708.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
                local_708.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
                local_708.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
                local_708.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
                local_708.exp = result_1.m_backend.exp;
                local_708.neg = result_1.m_backend.neg;
                local_708.fpclass = result_1.m_backend.fpclass;
                local_708.prec_elem = result_1.m_backend.prec_elem;
                tVar7 = boost::multiprecision::operator>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_708,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&degeneps.m_backend);
                if (tVar7) {
                  iVar10 = (*(this->
                             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._vptr_SPxRatioTester[3])();
                  local_688 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT44(extraout_var_16,iVar10);
                  local_208.fpclass = cpp_dec_float_finite;
                  local_208.prec_elem = 10;
                  local_208.data._M_elems._32_5_ = 0;
                  local_208._37_8_ = 0;
                  local_208.data._M_elems[4] = 0;
                  local_208.data._M_elems[5] = 0;
                  local_208.data._M_elems._24_5_ = 0;
                  local_208.data._M_elems[7]._1_3_ = 0;
                  local_208.data._M_elems[0] = 0;
                  local_208.data._M_elems[1] = 0;
                  local_208.data._M_elems[2] = 0;
                  local_208.data._M_elems[3] = 0;
                  boost::multiprecision::default_ops::
                  eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            (&local_208,
                             &(pVVar5->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar16].m_backend,
                             &degeneps.m_backend);
                  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::shiftLCbound(local_688,iVar9,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_208);
                }
                else {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                            (&local_708,&local_748);
                  tVar7 = boost::multiprecision::operator<=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_708,
                                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_4f8);
                  if (tVar7) {
                    result_1.m_backend.data._M_elems[1] = local_748.data._M_elems[1];
                    result_1.m_backend.data._M_elems[0] = local_748.data._M_elems[0];
                    result_1.m_backend.data._M_elems[3] = local_748.data._M_elems[3];
                    result_1.m_backend.data._M_elems[2] = local_748.data._M_elems[2];
                    result_1.m_backend.data._M_elems[5] = local_748.data._M_elems[5];
                    result_1.m_backend.data._M_elems[4] = local_748.data._M_elems[4];
                    result_1.m_backend.data._M_elems._32_5_ =
                         SUB85(CONCAT44(local_748.data._M_elems[9],local_748.data._M_elems[8]),0);
                    result_1.m_backend.data._M_elems[9]._1_3_ =
                         (undefined3)(local_748.data._M_elems[9] >> 8);
                    result_1.m_backend.data._M_elems[6] = local_748.data._M_elems[6];
                    result_1.m_backend.data._M_elems[7] = local_748.data._M_elems[7];
                    result_1.m_backend.exp = local_748.exp;
                    result_1.m_backend.neg = local_748.neg;
                    result_1.m_backend.fpclass = local_748.fpclass;
                    result_1.m_backend.prec_elem = local_748.prec_elem;
                    if (local_748.fpclass != cpp_dec_float_finite || local_748.data._M_elems[0] != 0
                       ) {
                      result_1.m_backend.neg = (bool)(local_748.neg ^ 1);
                    }
                    tVar7 = boost::multiprecision::operator>=
                                      (&result_1,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_668);
                    if (tVar7) {
                      iVar10 = (*(this->
                                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._vptr_SPxRatioTester[3])();
                      enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(extraout_var_18,iVar10),iVar9);
                      local_6c8.data._M_elems[7]._1_3_ = local_708.data._M_elems[7]._1_3_;
                      local_6c8.data._M_elems._24_5_ = local_708.data._M_elems._24_5_;
                      local_6c8.data._M_elems[0] = local_708.data._M_elems[0];
                      local_6c8.data._M_elems[1] = local_708.data._M_elems[1];
                      local_6c8.data._M_elems[2] = local_708.data._M_elems[2];
                      local_6c8.data._M_elems[3] = local_708.data._M_elems[3];
                      local_6c8.data._M_elems[4] = local_708.data._M_elems[4];
                      local_6c8.data._M_elems[5] = local_708.data._M_elems[5];
                      local_6c8.data._M_elems[9]._1_3_ = local_708.data._M_elems[9]._1_3_;
                      local_6c8.data._M_elems._32_5_ = local_708.data._M_elems._32_5_;
                      local_6c8.exp = local_708.exp;
                      local_6c8.neg = local_708.neg;
                      local_6c8.fpclass = local_708.fpclass;
                      local_6c8.prec_elem = local_708.prec_elem;
                      local_668.data._M_elems[0] = local_748.data._M_elems[0];
                      local_668.data._M_elems[9] = local_748.data._M_elems[9];
                      local_668.data._M_elems[5] = local_748.data._M_elems[5];
                      local_668.data._M_elems[6] = local_748.data._M_elems[6];
                      local_668.data._M_elems[7] = local_748.data._M_elems[7];
                      local_668.data._M_elems[8] = local_748.data._M_elems[8];
                      local_668.data._M_elems[1] = local_748.data._M_elems[1];
                      local_668.data._M_elems[2] = local_748.data._M_elems[2];
                      local_668.data._M_elems[3] = local_748.data._M_elems[3];
                      local_668.data._M_elems[4] = local_748.data._M_elems[4];
                      local_668.exp = local_748.exp;
                      local_668.neg =
                           (bool)((local_748.data._M_elems[0] != 0 ||
                                  local_748.fpclass != cpp_dec_float_finite) ^ local_748.neg);
                      local_668.fpclass = local_748.fpclass;
                      local_668.prec_elem = local_748.prec_elem;
                      local_628 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)CONCAT44(local_628._4_4_,uVar17);
                    }
                  }
                }
              }
              else {
                SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[](&result_1,local_600,iVar9);
                SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::clearNum(pSVar6,uVar17);
              }
            }
          }
          iVar9 = (*(this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SPxRatioTester[3])();
          (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar9) + 0x368))
                    (&result_1,(long *)CONCAT44(extraout_var_19,iVar9));
          bVar8 = boost::multiprecision::operator==(&local_478,&result_1);
          val = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_690;
        } while (!bVar8);
        if ((int)local_628 < 0) break;
        iVar9 = (*(this->
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SPxRatioTester[3])();
        bVar8 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(extraout_var_20,iVar9),&enterId);
        if (!bVar8) goto LAB_00240e34;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::clearNum(local_600,(int)local_628);
      }
      if ((int)i_00 < 0) {
LAB_00240ea2:
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(local_690,0);
        enterId.super_DataKey = enterId.super_DataKey & 0xffffffff00000000;
        uVar13._0_4_ = enterId.super_DataKey.info;
        uVar13._4_4_ = enterId.super_DataKey.idx;
        return (SPxId)uVar13;
      }
      iVar9 = (*(this->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SPxRatioTester[3])(this);
      lVar16 = *(long *)(CONCAT44(extraout_var_21,iVar9) + 0x790);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator*(&result_1,
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)*(int *)(*(long *)(lVar16 + 0x28) + 4 + (ulong)i_00 * 8) * 0x28 +
                     *(long *)(lVar16 + 0x20)),local_680);
      lVar16 = *plVar2;
      lVar15 = (ulong)i_00 * 0x38;
      *(ulong *)(lVar16 + 0x20 + lVar15) =
           CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                    result_1.m_backend.data._M_elems._32_5_);
      puVar1 = (uint *)(lVar16 + 0x10 + lVar15);
      *puVar1 = result_1.m_backend.data._M_elems[4];
      puVar1[1] = result_1.m_backend.data._M_elems[5];
      puVar1[2] = result_1.m_backend.data._M_elems[6];
      puVar1[3] = result_1.m_backend.data._M_elems[7];
      *(undefined8 *)(lVar16 + lVar15) = result_1.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((uint *)(lVar16 + lVar15) + 2) = result_1.m_backend.data._M_elems._8_8_;
      *(int *)(lVar16 + 0x28 + lVar15) = result_1.m_backend.exp;
      *(bool *)(lVar16 + 0x2c + lVar15) = result_1.m_backend.neg;
      *(undefined8 *)(lVar16 + 0x30 + lVar15) = result_1.m_backend._48_8_;
      iVar9 = (*(this->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SPxRatioTester[3])(this);
      bVar8 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(extraout_var_22,iVar9),&enterId);
      if (bVar8) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_68,0.0,(type *)0x0);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setValue(local_670,i_00,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_68);
        val = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_690;
        goto LAB_0023e1c4;
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[](&result_1,local_670,i_00);
      local_748.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
      local_748.data._M_elems[9] =
           (uint)(CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                           result_1.m_backend.data._M_elems._32_5_) >> 0x20);
      local_748.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
      local_748.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
      local_748.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
      local_748.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
      local_748.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
      local_748.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
      local_748.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
      local_748.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
      local_748.exp = result_1.m_backend.exp;
      local_748.neg = result_1.m_backend.neg;
      local_748.fpclass = result_1.m_backend.fpclass;
      local_748.prec_elem = result_1.m_backend.prec_elem;
      result_1.m_backend.data._M_elems._0_8_ = (ulong)local_748.data._M_elems[1] << 0x20;
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_748,(int *)&result_1);
      if (tVar7) {
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend.data._M_elems[9]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)(*local_610 + lVar15),
                   (cpp_dec_float<50U,_int,_void> *)(*plVar2 + lVar15));
        local_6c8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
        local_6c8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
        local_6c8.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
        local_6c8.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
        local_6c8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
        local_6c8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
        local_6c8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
        local_6c8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
        local_6c8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
        local_6c8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
        local_6c8.exp = result_1.m_backend.exp;
        local_6c8.neg = result_1.m_backend.neg;
        local_6c8.fpclass = result_1.m_backend.fpclass;
        local_6c8.prec_elem = result_1.m_backend.prec_elem;
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_748,&minStability);
        if ((tVar7) &&
           (tVar7 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_6c8,b), tVar7)) {
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0x40000000;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                    (&minStability.m_backend,(double *)&result_1);
          iVar9 = (*(this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SPxRatioTester[3])();
          lVar16 = *plVar2;
          local_248.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar16 + lVar15);
          local_248.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar16 + lVar15) + 2);
          puVar1 = (uint *)(lVar16 + 0x10 + lVar15);
          local_248.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_248.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_248.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar16 + 0x20 + lVar15);
          local_248.m_backend.exp = *(int *)(lVar16 + 0x28 + lVar15);
          local_248.m_backend.neg = *(bool *)(lVar16 + 0x2c + lVar15);
          local_248.m_backend._48_8_ = *(undefined8 *)(lVar16 + 0x30 + lVar15);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(extraout_var_23,iVar9),i_00,&local_248);
          val = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_690;
          goto LAB_0023e1c4;
        }
      }
      else {
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend.data._M_elems[9]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)(*local_618 + lVar15),
                   (cpp_dec_float<50U,_int,_void> *)(*plVar2 + lVar15));
        local_6c8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
        local_6c8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
        local_6c8.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
        local_6c8.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
        local_6c8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
        local_6c8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
        local_6c8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
        local_6c8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
        local_6c8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
        local_6c8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
        local_6c8.exp = result_1.m_backend.exp;
        local_6c8.neg = result_1.m_backend.neg;
        local_6c8.fpclass = result_1.m_backend.fpclass;
        local_6c8.prec_elem = result_1.m_backend.prec_elem;
        result_1.m_backend.data._M_elems._32_5_ =
             SUB85(CONCAT44(local_748.data._M_elems[9],local_748.data._M_elems[8]),0);
        result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)(local_748.data._M_elems[9] >> 8);
        result_1.m_backend.data._M_elems[1] = local_748.data._M_elems[1];
        result_1.m_backend.data._M_elems[0] = local_748.data._M_elems[0];
        result_1.m_backend.data._M_elems[3] = local_748.data._M_elems[3];
        result_1.m_backend.data._M_elems[2] = local_748.data._M_elems[2];
        result_1.m_backend.data._M_elems[5] = local_748.data._M_elems[5];
        result_1.m_backend.data._M_elems[4] = local_748.data._M_elems[4];
        result_1.m_backend.data._M_elems[6] = local_748.data._M_elems[6];
        result_1.m_backend.data._M_elems[7] = local_748.data._M_elems[7];
        result_1.m_backend.exp = local_748.exp;
        result_1.m_backend.neg = local_748.neg;
        result_1.m_backend.fpclass = local_748.fpclass;
        result_1.m_backend.prec_elem = local_748.prec_elem;
        if (local_748.fpclass != cpp_dec_float_finite || local_748.data._M_elems[0] != 0) {
          result_1.m_backend.neg = (bool)(local_748.neg ^ 1);
        }
        tVar7 = boost::multiprecision::operator<(&result_1,&minStability);
        if (tVar7) {
          result.m_backend.data._M_elems[0] = local_6c8.data._M_elems[0];
          result.m_backend.data._M_elems[1] = local_6c8.data._M_elems[1];
          uVar12 = result.m_backend.data._M_elems._0_8_;
          result.m_backend.data._M_elems[2] = local_6c8.data._M_elems[2];
          result.m_backend.data._M_elems[3] = local_6c8.data._M_elems[3];
          result.m_backend.data._M_elems._32_5_ = local_6c8.data._M_elems._32_5_;
          result.m_backend.data._M_elems[9]._1_3_ = local_6c8.data._M_elems[9]._1_3_;
          result.m_backend.data._M_elems[4] = local_6c8.data._M_elems[4];
          result.m_backend.data._M_elems[5] = local_6c8.data._M_elems[5];
          result.m_backend.data._M_elems._24_5_ = local_6c8.data._M_elems._24_5_;
          result.m_backend.data._M_elems[7]._1_3_ = local_6c8.data._M_elems[7]._1_3_;
          result.m_backend.exp = local_6c8.exp;
          result.m_backend.neg = local_6c8.neg;
          result.m_backend.fpclass = local_6c8.fpclass;
          result.m_backend.prec_elem = local_6c8.prec_elem;
          result.m_backend.data._M_elems[0] = local_6c8.data._M_elems[0];
          if (local_6c8.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(local_6c8.neg ^ 1);
          }
          result.m_backend.data._M_elems._0_8_ = uVar12;
          tVar7 = boost::multiprecision::operator<(&result,b);
          if (tVar7) {
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0x40000000;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                      (&minStability.m_backend,(double *)&result_1);
            iVar9 = (*(this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )._vptr_SPxRatioTester[3])();
            lVar16 = *plVar2;
            local_288.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar16 + lVar15);
            local_288.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar16 + lVar15) + 2)
            ;
            puVar1 = (uint *)(lVar16 + 0x10 + lVar15);
            local_288.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_288.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            local_288.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar16 + 0x20 + lVar15);
            local_288.m_backend.exp = *(int *)(lVar16 + 0x28 + lVar15);
            local_288.m_backend.neg = *(bool *)(lVar16 + 0x2c + lVar15);
            local_288.m_backend._48_8_ = *(undefined8 *)(lVar16 + 0x30 + lVar15);
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(extraout_var_24,iVar9),i_00,&local_288);
            val = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_690;
            goto LAB_0023e1c4;
          }
        }
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                (&local_6c8,&local_748);
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_6c8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_4f8);
      val = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_690;
    } while (tVar7);
  }
  else {
    result_1.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    result_1.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    uVar12 = result_1.m_backend.data._M_elems._0_8_;
    result_1.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    result_1.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    result_1.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
    result_1.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
    result_1.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    result_1.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    result_1.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
    result_1.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
    result_1.m_backend.exp = epsilon.m_backend.exp;
    result_1.m_backend.neg = epsilon.m_backend.neg;
    result_1.m_backend.fpclass = epsilon.m_backend.fpclass;
    result_1.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    result_1.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    if (epsilon.m_backend.fpclass != cpp_dec_float_finite ||
        result_1.m_backend.data._M_elems[0] != 0) {
      result_1.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
    }
    result_1.m_backend.data._M_elems._0_8_ = uVar12;
    tVar7 = boost::multiprecision::operator<(val,&result_1);
    if (tVar7) {
      local_628 = &(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta;
LAB_0023f90f:
      do {
        while( true ) {
          while( true ) {
            do {
              local_4f8.data._M_elems._32_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 8)
              ;
              local_4f8.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems;
              local_4f8.data._M_elems._8_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 2)
              ;
              local_4f8.data._M_elems[4] =
                   (((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems[4];
              local_4f8.data._M_elems[5] =
                   (((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems[5];
              local_4f8.data._M_elems[6] =
                   (((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems[6];
              local_4f8.data._M_elems[7] =
                   (((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems[7];
              local_4f8.exp = (val->m_backend).exp;
              local_4f8.neg = (val->m_backend).neg;
              local_4f8.fpclass = (val->m_backend).fpclass;
              local_4f8.prec_elem = (val->m_backend).prec_elem;
              iVar9 = (*(this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        )._vptr_SPxRatioTester[3])(this);
              (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar9) + 0x368))
                        (&result_1,(long *)CONCAT44(extraout_var_25,iVar9));
              local_478.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
              local_478.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_
              ;
              local_478.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
              local_478.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
              local_478.m_backend.data._M_elems._24_5_ =
                   SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],
                                  result_1.m_backend.data._M_elems[6]),0);
              local_478.m_backend.data._M_elems[7]._1_3_ =
                   (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
              local_478.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
              local_478.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
              local_478.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
              local_478.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
              local_478.m_backend.exp = result_1.m_backend.exp;
              local_478.m_backend.neg = result_1.m_backend.neg;
              local_478.m_backend.fpclass = result_1.m_backend.fpclass;
              local_478.m_backend.prec_elem = result_1.m_backend.prec_elem;
              minDelta(this,&rmaxabs,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_4f8,*(int *)(local_678 + 0x58),*(int **)(local_678 + 0x60),
                       *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         **)(local_678 + 0x70),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)*plVar2,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)*local_618,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)*local_610);
              minDelta(this,&cmaxabs,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_4f8,*(int *)(local_608 + 0x58),*(int **)(local_608 + 0x60),
                       *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         **)(local_608 + 0x70),
                       (local_680->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)*local_580,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)*local_578);
              bVar8 = boost::multiprecision::operator==
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_4f8,val);
              if (bVar8) {
                uVar12._0_4_ = enterId.super_DataKey.info;
                uVar12._4_4_ = enterId.super_DataKey.idx;
                return (SPxId)uVar12;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        (&local_668,0);
              pdVar11 = (double *)infinity();
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        (&result_1.m_backend,*pdVar11,(type *)0x0);
              local_6c8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
              local_6c8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
              local_6c8.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
              local_6c8.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
              local_6c8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
              local_6c8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
              local_6c8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
              local_6c8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
              local_6c8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
              local_6c8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
              local_6c8.exp = result_1.m_backend.exp;
              local_6c8.neg = result_1.m_backend.neg;
              local_6c8.fpclass = result_1.m_backend.fpclass;
              local_6c8.prec_elem = result_1.m_backend.prec_elem;
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 10;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems._24_5_ = 0;
              result.m_backend.data._M_elems[7]._1_3_ = 0;
              result.m_backend.data._M_elems._32_5_ = 0;
              result.m_backend.data._M_elems[9]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result.m_backend,&rmaxabs.m_backend,&epsilon.m_backend);
              local_620 = 0.001;
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems._32_5_ = 0;
              result_1.m_backend.data._M_elems[9]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                        (&result_1.m_backend,&result.m_backend,&local_620);
              local_5f8.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
              local_5f8.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_
              ;
              local_5f8.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
              local_5f8.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
              local_5f8.m_backend.data._M_elems._24_5_ =
                   SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],
                                  result_1.m_backend.data._M_elems[6]),0);
              local_5f8.m_backend.data._M_elems[7]._1_3_ =
                   (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
              local_5f8.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
              local_5f8.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
              local_5f8.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
              local_5f8.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
              local_5f8.m_backend.exp = result_1.m_backend.exp;
              local_5f8.m_backend.neg = result_1.m_backend.neg;
              local_5f8.m_backend.fpclass = result_1.m_backend.fpclass;
              local_5f8.m_backend.prec_elem = result_1.m_backend.prec_elem;
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 10;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems._24_5_ = 0;
              result.m_backend.data._M_elems[7]._1_3_ = 0;
              result.m_backend.data._M_elems._32_5_ = 0;
              result.m_backend.data._M_elems[9]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result.m_backend,&cmaxabs.m_backend,&epsilon.m_backend);
              local_620 = 0.001;
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems._32_5_ = 0;
              result_1.m_backend.data._M_elems[9]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                        (&result_1.m_backend,&result.m_backend,&local_620);
              local_5b8.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
              local_5b8.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_
              ;
              local_5b8.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
              local_5b8.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
              local_5b8.m_backend.data._M_elems._24_5_ =
                   SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],
                                  result_1.m_backend.data._M_elems[6]),0);
              local_5b8.m_backend.data._M_elems[7]._1_3_ =
                   (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
              local_5b8.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
              local_5b8.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
              local_5b8.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
              local_5b8.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
              local_5b8.m_backend.exp = result_1.m_backend.exp;
              local_5b8.m_backend.neg = result_1.m_backend.neg;
              local_5b8.m_backend.fpclass = result_1.m_backend.fpclass;
              local_5b8.m_backend.prec_elem = result_1.m_backend.prec_elem;
              uVar17 = *(uint *)(local_678 + 0x58);
              local_688 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(local_688._4_4_,0xffffffff);
              while( true ) {
                if ((int)uVar17 < 1) break;
                uVar17 = uVar17 - 1;
                iVar9 = *(int *)(*(long *)(local_678 + 0x60) + (ulong)uVar17 * 4);
                SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[](&result_1,local_670,iVar9);
                local_748.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
                local_748.data._M_elems[9] =
                     (uint)(CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                                     result_1.m_backend.data._M_elems._32_5_) >> 0x20);
                local_748.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
                local_748.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
                local_748.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
                local_748.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
                local_748.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
                local_748.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
                local_748.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
                local_748.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
                local_748.exp = result_1.m_backend.exp;
                local_748.neg = result_1.m_backend.neg;
                local_748.fpclass = result_1.m_backend.fpclass;
                local_748.prec_elem = result_1.m_backend.prec_elem;
                tVar7 = boost::multiprecision::operator>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_748,&local_5f8);
                if (tVar7) {
                  lVar16 = (long)iVar9 * 0x38;
                  result_1.m_backend.fpclass = cpp_dec_float_finite;
                  result_1.m_backend.prec_elem = 10;
                  result_1.m_backend.data._M_elems[0] = 0;
                  result_1.m_backend.data._M_elems[1] = 0;
                  result_1.m_backend.data._M_elems[2] = 0;
                  result_1.m_backend.data._M_elems[3] = 0;
                  result_1.m_backend.data._M_elems[4] = 0;
                  result_1.m_backend.data._M_elems[5] = 0;
                  result_1.m_backend.data._M_elems[6] = 0;
                  result_1.m_backend.data._M_elems[7] = 0;
                  result_1.m_backend.data._M_elems._32_5_ = 0;
                  result_1.m_backend.data._M_elems[9]._1_3_ = 0;
                  result_1.m_backend.exp = 0;
                  result_1.m_backend.neg = false;
                  boost::multiprecision::default_ops::
                  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            (&result_1.m_backend,
                             (cpp_dec_float<50U,_int,_void> *)(*local_618 + lVar16),
                             (cpp_dec_float<50U,_int,_void> *)(*plVar2 + lVar16));
                  local_708.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
                  local_708.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
                  local_708.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
                  local_708.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
                  local_708.data._M_elems._24_5_ =
                       SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],
                                      result_1.m_backend.data._M_elems[6]),0);
                  local_708.data._M_elems[7]._1_3_ =
                       (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
                  local_708.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
                  local_708.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
                  local_708.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
                  local_708.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
                  local_708.exp = result_1.m_backend.exp;
                  local_708.neg = result_1.m_backend.neg;
                  local_708.fpclass = result_1.m_backend.fpclass;
                  local_708.prec_elem = result_1.m_backend.prec_elem;
                  tVar7 = boost::multiprecision::operator>
                                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_708,&degeneps);
                  if (tVar7) {
                    iVar10 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    lVar15 = *plVar2;
                    local_2c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar15 + lVar16);
                    local_2c8.m_backend.data._M_elems._8_8_ =
                         *(undefined8 *)((uint *)(lVar15 + lVar16) + 2);
                    puVar1 = (uint *)(lVar15 + 0x10 + lVar16);
                    local_2c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                    local_2c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
                    local_2c8.m_backend.data._M_elems._32_8_ =
                         *(undefined8 *)(lVar15 + 0x20 + lVar16);
                    local_2c8.m_backend.exp = *(int *)(lVar15 + 0x28 + lVar16);
                    local_2c8.m_backend.neg = *(bool *)(lVar15 + 0x2c + lVar16);
                    local_2c8.m_backend._48_8_ = *(undefined8 *)(lVar15 + 0x30 + lVar16);
                    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_26,iVar10),iVar9,&local_2c8);
                  }
                  else {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                              (&local_708,&local_748);
                    tVar7 = boost::multiprecision::operator>=
                                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_708,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_4f8);
                    if ((tVar7) &&
                       (tVar7 = boost::multiprecision::operator>
                                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_748,
                                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_668), tVar7)) {
                      iVar10 = (*(this->
                                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._vptr_SPxRatioTester[3])();
                      enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(extraout_var_28,iVar10),iVar9);
                      local_6c8.data._M_elems[0] = local_708.data._M_elems[0];
                      local_6c8.data._M_elems[1] = local_708.data._M_elems[1];
                      local_6c8.data._M_elems[2] = local_708.data._M_elems[2];
                      local_6c8.data._M_elems[3] = local_708.data._M_elems[3];
                      local_6c8.data._M_elems[4] = local_708.data._M_elems[4];
                      local_6c8.data._M_elems[5] = local_708.data._M_elems[5];
                      local_6c8.data._M_elems[7]._1_3_ = local_708.data._M_elems[7]._1_3_;
                      local_6c8.data._M_elems._24_5_ = local_708.data._M_elems._24_5_;
                      local_6c8.data._M_elems[9]._1_3_ = local_708.data._M_elems[9]._1_3_;
                      local_6c8.data._M_elems._32_5_ = local_708.data._M_elems._32_5_;
                      local_6c8.exp = local_708.exp;
                      local_6c8.neg = local_708.neg;
                      local_6c8.fpclass = local_708.fpclass;
                      local_6c8.prec_elem = local_708.prec_elem;
                      local_668.data._M_elems[0] = local_748.data._M_elems[0];
                      local_668.data._M_elems[1] = local_748.data._M_elems[1];
                      local_668.data._M_elems[2] = local_748.data._M_elems[2];
                      local_668.data._M_elems[3] = local_748.data._M_elems[3];
                      local_668.data._M_elems[4] = local_748.data._M_elems[4];
                      local_668.data._M_elems[5] = local_748.data._M_elems[5];
                      local_668.data._M_elems[6] = local_748.data._M_elems[6];
                      local_668.data._M_elems[7] = local_748.data._M_elems[7];
                      local_668.data._M_elems[8] = local_748.data._M_elems[8];
                      local_668.data._M_elems[9] = local_748.data._M_elems[9];
                      local_668.exp = local_748.exp;
                      local_668.neg = local_748.neg;
                      local_668.fpclass = local_748.fpclass;
                      local_668.prec_elem = local_748.prec_elem;
                      local_688 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(local_688._4_4_,iVar9);
                    }
                  }
                }
                else {
                  result_1.m_backend.data._M_elems[0] = local_5f8.m_backend.data._M_elems[0];
                  result_1.m_backend.data._M_elems[1] = local_5f8.m_backend.data._M_elems[1];
                  uVar12 = result_1.m_backend.data._M_elems._0_8_;
                  result_1.m_backend.data._M_elems[2] = local_5f8.m_backend.data._M_elems[2];
                  result_1.m_backend.data._M_elems[3] = local_5f8.m_backend.data._M_elems[3];
                  result_1.m_backend.data._M_elems._32_5_ = local_5f8.m_backend.data._M_elems._32_5_
                  ;
                  result_1.m_backend.data._M_elems[9]._1_3_ =
                       local_5f8.m_backend.data._M_elems[9]._1_3_;
                  result_1.m_backend.data._M_elems[4] = local_5f8.m_backend.data._M_elems[4];
                  result_1.m_backend.data._M_elems[5] = local_5f8.m_backend.data._M_elems[5];
                  result_1.m_backend.data._M_elems[6] = local_5f8.m_backend.data._M_elems[6];
                  result_1.m_backend.data._M_elems[7] =
                       (uint)(CONCAT35(local_5f8.m_backend.data._M_elems[7]._1_3_,
                                       local_5f8.m_backend.data._M_elems._24_5_) >> 0x20);
                  result_1.m_backend.exp = local_5f8.m_backend.exp;
                  result_1.m_backend.neg = local_5f8.m_backend.neg;
                  result_1.m_backend.fpclass = local_5f8.m_backend.fpclass;
                  result_1.m_backend.prec_elem = local_5f8.m_backend.prec_elem;
                  result_1.m_backend.data._M_elems[0] = local_5f8.m_backend.data._M_elems[0];
                  if (local_5f8.m_backend.fpclass != cpp_dec_float_finite ||
                      result_1.m_backend.data._M_elems[0] != 0) {
                    result_1.m_backend.neg = (bool)(local_5f8.m_backend.neg ^ 1);
                  }
                  result_1.m_backend.data._M_elems._0_8_ = uVar12;
                  tVar7 = boost::multiprecision::operator<
                                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_748,&result_1);
                  pSVar6 = local_670;
                  if (tVar7) {
                    lVar16 = (long)iVar9 * 0x38;
                    result_1.m_backend.fpclass = cpp_dec_float_finite;
                    result_1.m_backend.prec_elem = 10;
                    result_1.m_backend.data._M_elems[0] = 0;
                    result_1.m_backend.data._M_elems[1] = 0;
                    result_1.m_backend.data._M_elems[2] = 0;
                    result_1.m_backend.data._M_elems[3] = 0;
                    result_1.m_backend.data._M_elems[4] = 0;
                    result_1.m_backend.data._M_elems[5] = 0;
                    result_1.m_backend.data._M_elems[6] = 0;
                    result_1.m_backend.data._M_elems[7] = 0;
                    result_1.m_backend.data._M_elems._32_5_ = 0;
                    result_1.m_backend.data._M_elems[9]._1_3_ = 0;
                    result_1.m_backend.exp = 0;
                    result_1.m_backend.neg = false;
                    boost::multiprecision::default_ops::
                    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              (&result_1.m_backend,
                               (cpp_dec_float<50U,_int,_void> *)(*local_610 + lVar16),
                               (cpp_dec_float<50U,_int,_void> *)(*plVar2 + lVar16));
                    local_708.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
                    local_708.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
                    local_708.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
                    local_708.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
                    local_708.data._M_elems._24_5_ =
                         SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],
                                        result_1.m_backend.data._M_elems[6]),0);
                    local_708.data._M_elems[7]._1_3_ =
                         (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
                    local_708.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
                    local_708.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
                    local_708.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
                    local_708.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
                    local_708.exp = result_1.m_backend.exp;
                    local_708.neg = result_1.m_backend.neg;
                    local_708.fpclass = result_1.m_backend.fpclass;
                    local_708.prec_elem = result_1.m_backend.prec_elem;
                    result_1.m_backend.data._M_elems._32_5_ =
                         degeneps.m_backend.data._M_elems._32_5_;
                    result_1.m_backend.data._M_elems[9]._1_3_ =
                         degeneps.m_backend.data._M_elems[9]._1_3_;
                    result_1.m_backend.data._M_elems[4] = degeneps.m_backend.data._M_elems[4];
                    result_1.m_backend.data._M_elems[5] = degeneps.m_backend.data._M_elems[5];
                    result_1.m_backend.data._M_elems[6] = degeneps.m_backend.data._M_elems[6];
                    result_1.m_backend.data._M_elems[7] = degeneps.m_backend.data._M_elems[7];
                    result_1.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
                    result_1.m_backend.data._M_elems[1] = degeneps.m_backend.data._M_elems[1];
                    uVar12 = result_1.m_backend.data._M_elems._0_8_;
                    result_1.m_backend.data._M_elems[2] = degeneps.m_backend.data._M_elems[2];
                    result_1.m_backend.data._M_elems[3] = degeneps.m_backend.data._M_elems[3];
                    result_1.m_backend.exp = degeneps.m_backend.exp;
                    result_1.m_backend.neg = degeneps.m_backend.neg;
                    result_1.m_backend.fpclass = degeneps.m_backend.fpclass;
                    result_1.m_backend.prec_elem = degeneps.m_backend.prec_elem;
                    result_1.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
                    if (degeneps.m_backend.fpclass != cpp_dec_float_finite ||
                        result_1.m_backend.data._M_elems[0] != 0) {
                      result_1.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
                    }
                    result_1.m_backend.data._M_elems._0_8_ = uVar12;
                    tVar7 = boost::multiprecision::operator<
                                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_708,&result_1);
                    if (tVar7) {
                      iVar10 = (*(this->
                                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._vptr_SPxRatioTester[3])();
                      lVar15 = *plVar2;
                      local_308.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar15 + lVar16);
                      local_308.m_backend.data._M_elems._8_8_ =
                           *(undefined8 *)((uint *)(lVar15 + lVar16) + 2);
                      puVar1 = (uint *)(lVar15 + 0x10 + lVar16);
                      local_308.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                      local_308.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
                      local_308.m_backend.data._M_elems._32_8_ =
                           *(undefined8 *)(lVar15 + 0x20 + lVar16);
                      local_308.m_backend.exp = *(int *)(lVar15 + 0x28 + lVar16);
                      local_308.m_backend.neg = *(bool *)(lVar15 + 0x2c + lVar16);
                      local_308.m_backend._48_8_ = *(undefined8 *)(lVar15 + 0x30 + lVar16);
                      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(extraout_var_27,iVar10),iVar9,&local_308);
                    }
                    else {
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                                (&local_708,&local_748);
                      tVar7 = boost::multiprecision::operator>=
                                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_708,
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_4f8);
                      if (tVar7) {
                        result_1.m_backend.data._M_elems[1] = local_748.data._M_elems[1];
                        result_1.m_backend.data._M_elems[0] = local_748.data._M_elems[0];
                        result_1.m_backend.data._M_elems[3] = local_748.data._M_elems[3];
                        result_1.m_backend.data._M_elems[2] = local_748.data._M_elems[2];
                        result_1.m_backend.data._M_elems[5] = local_748.data._M_elems[5];
                        result_1.m_backend.data._M_elems[4] = local_748.data._M_elems[4];
                        result_1.m_backend.data._M_elems._32_5_ =
                             SUB85(CONCAT44(local_748.data._M_elems[9],local_748.data._M_elems[8]),0
                                  );
                        result_1.m_backend.data._M_elems[9]._1_3_ =
                             (undefined3)(local_748.data._M_elems[9] >> 8);
                        result_1.m_backend.data._M_elems[6] = local_748.data._M_elems[6];
                        result_1.m_backend.data._M_elems[7] = local_748.data._M_elems[7];
                        result_1.m_backend.exp = local_748.exp;
                        result_1.m_backend.neg = local_748.neg;
                        result_1.m_backend.fpclass = local_748.fpclass;
                        result_1.m_backend.prec_elem = local_748.prec_elem;
                        if (local_748.fpclass != cpp_dec_float_finite ||
                            local_748.data._M_elems[0] != 0) {
                          result_1.m_backend.neg = (bool)(local_748.neg ^ 1);
                        }
                        tVar7 = boost::multiprecision::operator>
                                          (&result_1,
                                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_668);
                        if (tVar7) {
                          iVar10 = (*(this->
                                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._vptr_SPxRatioTester[3])();
                          enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)CONCAT44(extraout_var_29,iVar10),iVar9);
                          local_6c8.data._M_elems[7]._1_3_ = local_708.data._M_elems[7]._1_3_;
                          local_6c8.data._M_elems._24_5_ = local_708.data._M_elems._24_5_;
                          local_6c8.data._M_elems[0] = local_708.data._M_elems[0];
                          local_6c8.data._M_elems[1] = local_708.data._M_elems[1];
                          local_6c8.data._M_elems[2] = local_708.data._M_elems[2];
                          local_6c8.data._M_elems[3] = local_708.data._M_elems[3];
                          local_6c8.data._M_elems[4] = local_708.data._M_elems[4];
                          local_6c8.data._M_elems[5] = local_708.data._M_elems[5];
                          local_6c8.data._M_elems[9]._1_3_ = local_708.data._M_elems[9]._1_3_;
                          local_6c8.data._M_elems._32_5_ = local_708.data._M_elems._32_5_;
                          local_6c8.exp = local_708.exp;
                          local_6c8.neg = local_708.neg;
                          local_6c8.fpclass = local_708.fpclass;
                          local_6c8.prec_elem = local_708.prec_elem;
                          local_668.data._M_elems[0] = local_748.data._M_elems[0];
                          local_668.data._M_elems[9] = local_748.data._M_elems[9];
                          local_668.data._M_elems[5] = local_748.data._M_elems[5];
                          local_668.data._M_elems[6] = local_748.data._M_elems[6];
                          local_668.data._M_elems[7] = local_748.data._M_elems[7];
                          local_668.data._M_elems[8] = local_748.data._M_elems[8];
                          local_668.data._M_elems[1] = local_748.data._M_elems[1];
                          local_668.data._M_elems[2] = local_748.data._M_elems[2];
                          local_668.data._M_elems[3] = local_748.data._M_elems[3];
                          local_668.data._M_elems[4] = local_748.data._M_elems[4];
                          local_668.exp = local_748.exp;
                          local_668.neg =
                               (bool)((local_748.data._M_elems[0] != 0 ||
                                      local_748.fpclass != cpp_dec_float_finite) ^ local_748.neg);
                          local_668.fpclass = local_748.fpclass;
                          local_668.prec_elem = local_748.prec_elem;
                          local_688 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)CONCAT44(local_688._4_4_,iVar9);
                        }
                      }
                    }
                  }
                  else {
                    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[](&result_1,local_670,iVar9);
                    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::clearNum(pSVar6,uVar17);
                  }
                }
              }
              uVar17 = *(uint *)(local_608 + 0x58);
              local_75c = 0xffffffff;
              while (0 < (int)uVar17) {
                uVar17 = uVar17 - 1;
                iVar9 = *(int *)(*(long *)(local_608 + 0x60) + (ulong)uVar17 * 4);
                lVar16 = (long)iVar9;
                SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[](&result_1,local_600,iVar9);
                local_748.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
                local_748.data._M_elems[9] =
                     (uint)(CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                                     result_1.m_backend.data._M_elems._32_5_) >> 0x20);
                local_748.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
                local_748.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
                local_748.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
                local_748.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
                local_748.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
                local_748.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
                local_748.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
                local_748.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
                local_748.exp = result_1.m_backend.exp;
                local_748.neg = result_1.m_backend.neg;
                local_748.fpclass = result_1.m_backend.fpclass;
                local_748.prec_elem = result_1.m_backend.prec_elem;
                tVar7 = boost::multiprecision::operator>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_748,&local_5b8);
                pVVar5 = local_680;
                if (tVar7) {
                  result_1.m_backend.fpclass = cpp_dec_float_finite;
                  result_1.m_backend.prec_elem = 10;
                  result_1.m_backend.data._M_elems[0] = 0;
                  result_1.m_backend.data._M_elems[1] = 0;
                  result_1.m_backend.data._M_elems[2] = 0;
                  result_1.m_backend.data._M_elems[3] = 0;
                  result_1.m_backend.data._M_elems[4] = 0;
                  result_1.m_backend.data._M_elems[5] = 0;
                  result_1.m_backend.data._M_elems[6] = 0;
                  result_1.m_backend.data._M_elems[7] = 0;
                  result_1.m_backend.data._M_elems._32_5_ = 0;
                  result_1.m_backend.data._M_elems[9]._1_3_ = 0;
                  result_1.m_backend.exp = 0;
                  result_1.m_backend.neg = false;
                  boost::multiprecision::default_ops::
                  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            (&result_1.m_backend,
                             (cpp_dec_float<50U,_int,_void> *)(*local_580 + lVar16 * 0x38),
                             &(local_680->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar16].m_backend);
                  local_708.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
                  local_708.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
                  local_708.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
                  local_708.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
                  local_708.data._M_elems._24_5_ =
                       SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],
                                      result_1.m_backend.data._M_elems[6]),0);
                  local_708.data._M_elems[7]._1_3_ =
                       (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
                  local_708.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
                  local_708.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
                  local_708.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
                  local_708.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
                  local_708.exp = result_1.m_backend.exp;
                  local_708.neg = result_1.m_backend.neg;
                  local_708.fpclass = result_1.m_backend.fpclass;
                  local_708.prec_elem = result_1.m_backend.prec_elem;
                  tVar7 = boost::multiprecision::operator>
                                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_708,&degeneps);
                  if (tVar7) {
                    iVar10 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    pnVar3 = (pVVar5->val).
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    local_348.m_backend.data._M_elems._0_8_ =
                         *(undefined8 *)&pnVar3[lVar16].m_backend.data;
                    local_348.m_backend.data._M_elems._8_8_ =
                         *(undefined8 *)(pnVar3[lVar16].m_backend.data._M_elems + 2);
                    puVar1 = pnVar3[lVar16].m_backend.data._M_elems + 4;
                    local_348.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                    local_348.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
                    local_348.m_backend.data._M_elems._32_8_ =
                         *(undefined8 *)(pnVar3[lVar16].m_backend.data._M_elems + 8);
                    local_348.m_backend.exp = pnVar3[lVar16].m_backend.exp;
                    local_348.m_backend.neg = pnVar3[lVar16].m_backend.neg;
                    local_348.m_backend.fpclass = pnVar3[lVar16].m_backend.fpclass;
                    local_348.m_backend.prec_elem = pnVar3[lVar16].m_backend.prec_elem;
                    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::shiftLCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_30,iVar10),iVar9,&local_348);
                  }
                  else {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                              (&local_708,&local_748);
                    tVar7 = boost::multiprecision::operator>=
                                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_708,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_4f8);
                    if ((tVar7) &&
                       (tVar7 = boost::multiprecision::operator>
                                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_748,
                                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_668), tVar7)) {
                      iVar10 = (*(this->
                                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._vptr_SPxRatioTester[3])();
                      enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(extraout_var_32,iVar10),iVar9);
                      local_6c8.data._M_elems[0] = local_708.data._M_elems[0];
                      local_6c8.data._M_elems[1] = local_708.data._M_elems[1];
                      local_6c8.data._M_elems[2] = local_708.data._M_elems[2];
                      local_6c8.data._M_elems[3] = local_708.data._M_elems[3];
                      local_6c8.data._M_elems[4] = local_708.data._M_elems[4];
                      local_6c8.data._M_elems[5] = local_708.data._M_elems[5];
                      local_6c8.data._M_elems[7]._1_3_ = local_708.data._M_elems[7]._1_3_;
                      local_6c8.data._M_elems._24_5_ = local_708.data._M_elems._24_5_;
                      local_6c8.data._M_elems[9]._1_3_ = local_708.data._M_elems[9]._1_3_;
                      local_6c8.data._M_elems._32_5_ = local_708.data._M_elems._32_5_;
                      local_6c8.exp = local_708.exp;
                      local_6c8.neg = local_708.neg;
                      local_6c8.fpclass = local_708.fpclass;
                      local_6c8.prec_elem = local_708.prec_elem;
                      local_668.data._M_elems[0] = local_748.data._M_elems[0];
                      local_668.data._M_elems[1] = local_748.data._M_elems[1];
                      local_668.data._M_elems[2] = local_748.data._M_elems[2];
                      local_668.data._M_elems[3] = local_748.data._M_elems[3];
                      local_668.data._M_elems[4] = local_748.data._M_elems[4];
                      local_668.data._M_elems[5] = local_748.data._M_elems[5];
                      local_668.data._M_elems[6] = local_748.data._M_elems[6];
                      local_668.data._M_elems[7] = local_748.data._M_elems[7];
                      local_668.data._M_elems[8] = local_748.data._M_elems[8];
                      local_668.data._M_elems[9] = local_748.data._M_elems[9];
                      local_668.exp = local_748.exp;
                      local_668.neg = local_748.neg;
                      local_668.fpclass = local_748.fpclass;
                      local_668.prec_elem = local_748.prec_elem;
                      local_75c = uVar17;
                    }
                  }
                }
                else {
                  result_1.m_backend.data._M_elems[0] = local_5b8.m_backend.data._M_elems[0];
                  result_1.m_backend.data._M_elems[1] = local_5b8.m_backend.data._M_elems[1];
                  uVar12 = result_1.m_backend.data._M_elems._0_8_;
                  result_1.m_backend.data._M_elems[2] = local_5b8.m_backend.data._M_elems[2];
                  result_1.m_backend.data._M_elems[3] = local_5b8.m_backend.data._M_elems[3];
                  result_1.m_backend.data._M_elems._32_5_ = local_5b8.m_backend.data._M_elems._32_5_
                  ;
                  result_1.m_backend.data._M_elems[9]._1_3_ =
                       local_5b8.m_backend.data._M_elems[9]._1_3_;
                  result_1.m_backend.data._M_elems[4] = local_5b8.m_backend.data._M_elems[4];
                  result_1.m_backend.data._M_elems[5] = local_5b8.m_backend.data._M_elems[5];
                  result_1.m_backend.data._M_elems[6] = local_5b8.m_backend.data._M_elems[6];
                  result_1.m_backend.data._M_elems[7] =
                       (uint)(CONCAT35(local_5b8.m_backend.data._M_elems[7]._1_3_,
                                       local_5b8.m_backend.data._M_elems._24_5_) >> 0x20);
                  result_1.m_backend.exp = local_5b8.m_backend.exp;
                  result_1.m_backend.neg = local_5b8.m_backend.neg;
                  result_1.m_backend.fpclass = local_5b8.m_backend.fpclass;
                  result_1.m_backend.prec_elem = local_5b8.m_backend.prec_elem;
                  result_1.m_backend.data._M_elems[0] = local_5b8.m_backend.data._M_elems[0];
                  if (local_5b8.m_backend.fpclass != cpp_dec_float_finite ||
                      result_1.m_backend.data._M_elems[0] != 0) {
                    result_1.m_backend.neg = (bool)(local_5b8.m_backend.neg ^ 1);
                  }
                  result_1.m_backend.data._M_elems._0_8_ = uVar12;
                  tVar7 = boost::multiprecision::operator<
                                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_748,&result_1);
                  if (tVar7) {
                    result_1.m_backend.fpclass = cpp_dec_float_finite;
                    result_1.m_backend.prec_elem = 10;
                    result_1.m_backend.data._M_elems[0] = 0;
                    result_1.m_backend.data._M_elems[1] = 0;
                    result_1.m_backend.data._M_elems[2] = 0;
                    result_1.m_backend.data._M_elems[3] = 0;
                    result_1.m_backend.data._M_elems[4] = 0;
                    result_1.m_backend.data._M_elems[5] = 0;
                    result_1.m_backend.data._M_elems[6] = 0;
                    result_1.m_backend.data._M_elems[7] = 0;
                    result_1.m_backend.data._M_elems._32_5_ = 0;
                    result_1.m_backend.data._M_elems[9]._1_3_ = 0;
                    result_1.m_backend.exp = 0;
                    result_1.m_backend.neg = false;
                    boost::multiprecision::default_ops::
                    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              (&result_1.m_backend,
                               (cpp_dec_float<50U,_int,_void> *)(*local_578 + lVar16 * 0x38),
                               &(local_680->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar16].m_backend);
                    local_708.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
                    local_708.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
                    local_708.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
                    local_708.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
                    local_708.data._M_elems._24_5_ =
                         SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],
                                        result_1.m_backend.data._M_elems[6]),0);
                    local_708.data._M_elems[7]._1_3_ =
                         (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
                    local_708.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
                    local_708.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
                    local_708.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
                    local_708.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
                    local_708.exp = result_1.m_backend.exp;
                    local_708.neg = result_1.m_backend.neg;
                    local_708.fpclass = result_1.m_backend.fpclass;
                    local_708.prec_elem = result_1.m_backend.prec_elem;
                    result_1.m_backend.data._M_elems._32_5_ =
                         degeneps.m_backend.data._M_elems._32_5_;
                    result_1.m_backend.data._M_elems[9]._1_3_ =
                         degeneps.m_backend.data._M_elems[9]._1_3_;
                    result_1.m_backend.data._M_elems[4] = degeneps.m_backend.data._M_elems[4];
                    result_1.m_backend.data._M_elems[5] = degeneps.m_backend.data._M_elems[5];
                    result_1.m_backend.data._M_elems[6] = degeneps.m_backend.data._M_elems[6];
                    result_1.m_backend.data._M_elems[7] = degeneps.m_backend.data._M_elems[7];
                    result_1.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
                    result_1.m_backend.data._M_elems[1] = degeneps.m_backend.data._M_elems[1];
                    uVar12 = result_1.m_backend.data._M_elems._0_8_;
                    result_1.m_backend.data._M_elems[2] = degeneps.m_backend.data._M_elems[2];
                    result_1.m_backend.data._M_elems[3] = degeneps.m_backend.data._M_elems[3];
                    result_1.m_backend.exp = degeneps.m_backend.exp;
                    result_1.m_backend.neg = degeneps.m_backend.neg;
                    result_1.m_backend.fpclass = degeneps.m_backend.fpclass;
                    result_1.m_backend.prec_elem = degeneps.m_backend.prec_elem;
                    result_1.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
                    if (degeneps.m_backend.fpclass != cpp_dec_float_finite ||
                        result_1.m_backend.data._M_elems[0] != 0) {
                      result_1.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
                    }
                    result_1.m_backend.data._M_elems._0_8_ = uVar12;
                    tVar7 = boost::multiprecision::operator<
                                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_708,&result_1);
                    if (tVar7) {
                      iVar10 = (*(this->
                                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._vptr_SPxRatioTester[3])();
                      pnVar3 = (local_680->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      local_388.m_backend.data._M_elems._0_8_ =
                           *(undefined8 *)&pnVar3[lVar16].m_backend.data;
                      local_388.m_backend.data._M_elems._8_8_ =
                           *(undefined8 *)(pnVar3[lVar16].m_backend.data._M_elems + 2);
                      puVar1 = pnVar3[lVar16].m_backend.data._M_elems + 4;
                      local_388.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                      local_388.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
                      local_388.m_backend.data._M_elems._32_8_ =
                           *(undefined8 *)(pnVar3[lVar16].m_backend.data._M_elems + 8);
                      local_388.m_backend.exp = pnVar3[lVar16].m_backend.exp;
                      local_388.m_backend.neg = pnVar3[lVar16].m_backend.neg;
                      local_388.m_backend.fpclass = pnVar3[lVar16].m_backend.fpclass;
                      local_388.m_backend.prec_elem = pnVar3[lVar16].m_backend.prec_elem;
                      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::shiftUCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(extraout_var_31,iVar10),iVar9,&local_388);
                    }
                    else {
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                                (&local_708,&local_748);
                      tVar7 = boost::multiprecision::operator>=
                                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_708,
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_4f8);
                      if (tVar7) {
                        result_1.m_backend.data._M_elems[1] = local_748.data._M_elems[1];
                        result_1.m_backend.data._M_elems[0] = local_748.data._M_elems[0];
                        result_1.m_backend.data._M_elems[3] = local_748.data._M_elems[3];
                        result_1.m_backend.data._M_elems[2] = local_748.data._M_elems[2];
                        result_1.m_backend.data._M_elems[5] = local_748.data._M_elems[5];
                        result_1.m_backend.data._M_elems[4] = local_748.data._M_elems[4];
                        result_1.m_backend.data._M_elems._32_5_ =
                             SUB85(CONCAT44(local_748.data._M_elems[9],local_748.data._M_elems[8]),0
                                  );
                        result_1.m_backend.data._M_elems[9]._1_3_ =
                             (undefined3)(local_748.data._M_elems[9] >> 8);
                        result_1.m_backend.data._M_elems[6] = local_748.data._M_elems[6];
                        result_1.m_backend.data._M_elems[7] = local_748.data._M_elems[7];
                        result_1.m_backend.exp = local_748.exp;
                        result_1.m_backend.neg = local_748.neg;
                        result_1.m_backend.fpclass = local_748.fpclass;
                        result_1.m_backend.prec_elem = local_748.prec_elem;
                        if (local_748.fpclass != cpp_dec_float_finite ||
                            local_748.data._M_elems[0] != 0) {
                          result_1.m_backend.neg = (bool)(local_748.neg ^ 1);
                        }
                        tVar7 = boost::multiprecision::operator>
                                          (&result_1,
                                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_668);
                        if (tVar7) {
                          iVar10 = (*(this->
                                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._vptr_SPxRatioTester[3])();
                          enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            *)CONCAT44(extraout_var_33,iVar10),iVar9);
                          local_6c8.data._M_elems[7]._1_3_ = local_708.data._M_elems[7]._1_3_;
                          local_6c8.data._M_elems._24_5_ = local_708.data._M_elems._24_5_;
                          local_6c8.data._M_elems[0] = local_708.data._M_elems[0];
                          local_6c8.data._M_elems[1] = local_708.data._M_elems[1];
                          local_6c8.data._M_elems[2] = local_708.data._M_elems[2];
                          local_6c8.data._M_elems[3] = local_708.data._M_elems[3];
                          local_6c8.data._M_elems[4] = local_708.data._M_elems[4];
                          local_6c8.data._M_elems[5] = local_708.data._M_elems[5];
                          local_6c8.data._M_elems[9]._1_3_ = local_708.data._M_elems[9]._1_3_;
                          local_6c8.data._M_elems._32_5_ = local_708.data._M_elems._32_5_;
                          local_6c8.exp = local_708.exp;
                          local_6c8.neg = local_708.neg;
                          local_6c8.fpclass = local_708.fpclass;
                          local_6c8.prec_elem = local_708.prec_elem;
                          local_668.data._M_elems[0] = local_748.data._M_elems[0];
                          local_668.data._M_elems[9] = local_748.data._M_elems[9];
                          local_668.data._M_elems[5] = local_748.data._M_elems[5];
                          local_668.data._M_elems[6] = local_748.data._M_elems[6];
                          local_668.data._M_elems[7] = local_748.data._M_elems[7];
                          local_668.data._M_elems[8] = local_748.data._M_elems[8];
                          local_668.data._M_elems[1] = local_748.data._M_elems[1];
                          local_668.data._M_elems[2] = local_748.data._M_elems[2];
                          local_668.data._M_elems[3] = local_748.data._M_elems[3];
                          local_668.data._M_elems[4] = local_748.data._M_elems[4];
                          local_668.exp = local_748.exp;
                          local_668.neg =
                               (bool)((local_748.data._M_elems[0] != 0 ||
                                      local_748.fpclass != cpp_dec_float_finite) ^ local_748.neg);
                          local_668.fpclass = local_748.fpclass;
                          local_668.prec_elem = local_748.prec_elem;
                          local_75c = uVar17;
                        }
                      }
                    }
                  }
                  else {
                    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::clearNum(local_600,uVar17);
                  }
                }
              }
              iVar9 = (*(this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        )._vptr_SPxRatioTester[3])();
              (**(code **)(*(long *)CONCAT44(extraout_var_34,iVar9) + 0x368))
                        (&result_1,(long *)CONCAT44(extraout_var_34,iVar9));
              bVar8 = boost::multiprecision::operator==(&local_478,&result_1);
              pSVar4 = local_688;
              val = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_690;
            } while (!bVar8);
            if ((int)local_75c < 0) break;
            iVar9 = (*(this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )._vptr_SPxRatioTester[3])();
            bVar8 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT44(extraout_var_35,iVar9),&enterId);
            if (!bVar8) goto LAB_00240e34;
            SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::clearNum(local_600,local_75c);
          }
          iVar9 = (int)local_688;
          if ((int)local_688 < 0) goto LAB_00240ea2;
          iVar10 = (*(this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SPxRatioTester[3])(this);
          lVar16 = *(long *)(CONCAT44(extraout_var_36,iVar10) + 0x790);
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator*(&result_1,
                      (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)*(int *)(*(long *)(lVar16 + 0x28) + 4 +
                                        ((ulong)pSVar4 & 0xffffffff) * 8) * 0x28 +
                         *(long *)(lVar16 + 0x20)),local_680);
          lVar16 = *plVar2;
          lVar15 = ((ulong)pSVar4 & 0xffffffff) * 0x38;
          *(ulong *)(lVar16 + 0x20 + lVar15) =
               CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                        result_1.m_backend.data._M_elems._32_5_);
          puVar1 = (uint *)(lVar16 + 0x10 + lVar15);
          *puVar1 = result_1.m_backend.data._M_elems[4];
          puVar1[1] = result_1.m_backend.data._M_elems[5];
          puVar1[2] = result_1.m_backend.data._M_elems[6];
          puVar1[3] = result_1.m_backend.data._M_elems[7];
          *(undefined8 *)(lVar16 + lVar15) = result_1.m_backend.data._M_elems._0_8_;
          *(undefined8 *)((uint *)(lVar16 + lVar15) + 2) = result_1.m_backend.data._M_elems._8_8_;
          *(int *)(lVar16 + 0x28 + lVar15) = result_1.m_backend.exp;
          *(bool *)(lVar16 + 0x2c + lVar15) = result_1.m_backend.neg;
          *(undefined8 *)(lVar16 + 0x30 + lVar15) = result_1.m_backend._48_8_;
          iVar10 = (*(this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SPxRatioTester[3])(this);
          bVar8 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(extraout_var_37,iVar10),&enterId);
          if (!bVar8) break;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_a0,0.0,(type *)0x0);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::setValue(local_670,iVar9,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_a0);
          val = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_690;
        }
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[](&result_1,local_670,iVar9);
        local_748.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
        local_748.data._M_elems[9] =
             (uint)(CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                             result_1.m_backend.data._M_elems._32_5_) >> 0x20);
        local_748.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
        local_748.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
        local_748.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
        local_748.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
        local_748.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
        local_748.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
        local_748.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
        local_748.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
        local_748.exp = result_1.m_backend.exp;
        local_748.neg = result_1.m_backend.neg;
        local_748.fpclass = result_1.m_backend.fpclass;
        local_748.prec_elem = result_1.m_backend.prec_elem;
        result_1.m_backend.data._M_elems._0_8_ = (ulong)local_748.data._M_elems[1] << 0x20;
        tVar7 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_748,(int *)&result_1);
        if (tVar7) {
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend.data._M_elems[9]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)(*local_618 + lVar15),
                     (cpp_dec_float<50U,_int,_void> *)(*plVar2 + lVar15));
          local_6c8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_6c8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_6c8.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
          local_6c8.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
          local_6c8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_6c8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_6c8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_6c8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_6c8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_6c8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_6c8.exp = result_1.m_backend.exp;
          local_6c8.neg = result_1.m_backend.neg;
          local_6c8.fpclass = result_1.m_backend.fpclass;
          local_6c8.prec_elem = result_1.m_backend.prec_elem;
          tVar7 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_748,&minStability);
          val = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_690;
          if (tVar7) {
            result_1.m_backend.data._M_elems[0] = local_6c8.data._M_elems[0];
            result_1.m_backend.data._M_elems[1] = local_6c8.data._M_elems[1];
            uVar12 = result_1.m_backend.data._M_elems._0_8_;
            result_1.m_backend.data._M_elems[2] = local_6c8.data._M_elems[2];
            result_1.m_backend.data._M_elems[3] = local_6c8.data._M_elems[3];
            result_1.m_backend.data._M_elems._32_5_ = local_6c8.data._M_elems._32_5_;
            result_1.m_backend.data._M_elems[9]._1_3_ = local_6c8.data._M_elems[9]._1_3_;
            result_1.m_backend.data._M_elems[4] = local_6c8.data._M_elems[4];
            result_1.m_backend.data._M_elems[5] = local_6c8.data._M_elems[5];
            result_1.m_backend.data._M_elems[6] = local_6c8.data._M_elems[6];
            result_1.m_backend.data._M_elems[7] = local_6c8.data._M_elems[7];
            result_1.m_backend.exp = local_6c8.exp;
            result_1.m_backend.neg = local_6c8.neg;
            result_1.m_backend.fpclass = local_6c8.fpclass;
            result_1.m_backend.prec_elem = local_6c8.prec_elem;
            result_1.m_backend.data._M_elems[0] = local_6c8.data._M_elems[0];
            if (local_6c8.fpclass != cpp_dec_float_finite ||
                result_1.m_backend.data._M_elems[0] != 0) {
              result_1.m_backend.neg = (bool)(local_6c8.neg ^ 1);
            }
            result_1.m_backend.data._M_elems._0_8_ = uVar12;
            tVar7 = boost::multiprecision::operator<(&result_1,local_628);
            iVar9 = (int)local_688;
            if (tVar7) {
              boost::multiprecision::backends::eval_divide<50u,int,void>(&minStability.m_backend,2);
              iVar10 = (*(this->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              lVar16 = *plVar2;
              local_3c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar16 + lVar15);
              local_3c8.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((uint *)(lVar16 + lVar15) + 2);
              puVar1 = (uint *)(lVar16 + 0x10 + lVar15);
              local_3c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              local_3c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
              local_3c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar16 + 0x20 + lVar15);
              local_3c8.m_backend.exp = *(int *)(lVar16 + 0x28 + lVar15);
              local_3c8.m_backend.neg = *(bool *)(lVar16 + 0x2c + lVar15);
              local_3c8.m_backend._48_8_ = *(undefined8 *)(lVar16 + 0x30 + lVar15);
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(extraout_var_38,iVar10),iVar9,&local_3c8);
              goto LAB_0023f90f;
            }
          }
        }
        else {
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend.data._M_elems[9]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)(*local_610 + lVar15),
                     (cpp_dec_float<50U,_int,_void> *)(*plVar2 + lVar15));
          val = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_690;
          local_6c8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_6c8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_6c8.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
          local_6c8.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
          local_6c8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_6c8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_6c8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_6c8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_6c8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_6c8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_6c8.exp = result_1.m_backend.exp;
          local_6c8.neg = result_1.m_backend.neg;
          local_6c8.fpclass = result_1.m_backend.fpclass;
          local_6c8.prec_elem = result_1.m_backend.prec_elem;
          result_1.m_backend.data._M_elems._32_5_ =
               SUB85(CONCAT44(local_748.data._M_elems[9],local_748.data._M_elems[8]),0);
          result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)(local_748.data._M_elems[9] >> 8);
          result_1.m_backend.data._M_elems[1] = local_748.data._M_elems[1];
          result_1.m_backend.data._M_elems[0] = local_748.data._M_elems[0];
          result_1.m_backend.data._M_elems[3] = local_748.data._M_elems[3];
          result_1.m_backend.data._M_elems[2] = local_748.data._M_elems[2];
          result_1.m_backend.data._M_elems[5] = local_748.data._M_elems[5];
          result_1.m_backend.data._M_elems[4] = local_748.data._M_elems[4];
          result_1.m_backend.data._M_elems[6] = local_748.data._M_elems[6];
          result_1.m_backend.data._M_elems[7] = local_748.data._M_elems[7];
          result_1.m_backend.exp = local_748.exp;
          result_1.m_backend.neg = local_748.neg;
          result_1.m_backend.fpclass = local_748.fpclass;
          result_1.m_backend.prec_elem = local_748.prec_elem;
          if (local_748.fpclass != cpp_dec_float_finite || local_748.data._M_elems[0] != 0) {
            result_1.m_backend.neg = (bool)(local_748.neg ^ 1);
          }
          tVar7 = boost::multiprecision::operator<(&result_1,&minStability);
          iVar9 = (int)local_688;
          if ((tVar7) &&
             (tVar7 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_6c8,local_628), tVar7)) {
            boost::multiprecision::backends::eval_divide<50u,int,void>(&minStability.m_backend,2);
            iVar10 = (*(this->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._vptr_SPxRatioTester[3])();
            lVar16 = *plVar2;
            local_408.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar16 + lVar15);
            local_408.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar16 + lVar15) + 2)
            ;
            puVar1 = (uint *)(lVar16 + 0x10 + lVar15);
            local_408.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_408.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            local_408.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar16 + 0x20 + lVar15);
            local_408.m_backend.exp = *(int *)(lVar16 + 0x28 + lVar15);
            local_408.m_backend.neg = *(bool *)(lVar16 + 0x2c + lVar15);
            local_408.m_backend._48_8_ = *(undefined8 *)(lVar16 + 0x30 + lVar15);
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(extraout_var_39,iVar10),iVar9,&local_408);
            goto LAB_0023f90f;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                  (&local_6c8,&local_748);
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_6c8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_4f8);
      } while (tVar7);
    }
  }
LAB_00240e34:
  *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 8) =
       local_6c8.data._M_elems._32_8_;
  *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 4) =
       local_6c8.data._M_elems._16_8_;
  *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 6) =
       local_6c8.data._M_elems._24_8_;
  *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems =
       local_6c8.data._M_elems._0_8_;
  *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 2) =
       local_6c8.data._M_elems._8_8_;
  (val->m_backend).exp = local_6c8.exp;
  (val->m_backend).neg = local_6c8.neg;
  (val->m_backend).fpclass = local_6c8.fpclass;
  (val->m_backend).prec_elem = local_6c8.prec_elem;
  return (SPxId)enterId.super_DataKey;
}

Assistant:

SPxId SPxHarrisRT<R>::selectEnter(R& val, int, bool)
{
   int i, j;
   SPxId enterId;
   R stab, x, y;
   R max = 0.0;
   R sel = 0.0;
   R lastshift;
   R cuseeps;
   R ruseeps;
   R cmaxabs = 1;
   R rmaxabs = 1;
   int pnr, cnr;

   R minStability = this->tolerances()->scaleAccordingToEpsilon(1e-4);
   R epsilon      = this->solver()->epsilon();
   R degeneps     = degenerateEps();

   VectorBase<R>& pvec = this->solver()->pVec();
   SSVectorBase<R>& pupd = this->solver()->pVec().delta();

   VectorBase<R>& cvec = this->solver()->coPvec();
   SSVectorBase<R>& cupd = this->solver()->coPvec().delta();

   const VectorBase<R>& upb = this->solver()->upBound();
   const VectorBase<R>& lpb = this->solver()->lpBound();
   const VectorBase<R>& ucb = this->solver()->ucBound();
   const VectorBase<R>& lcb = this->solver()->lcBound();

   assert(this->delta > epsilon);
   assert(epsilon > 0);
   assert(this->solver()->maxCycle() > 0);

   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   if(val > epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);

         // phase 1:
         maxDelta(
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         maxDelta(
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(-infinity);
         ruseeps = rmaxabs * 0.001 * epsilon;

         if(ruseeps < epsilon)
            ruseeps = epsilon;

         cuseeps = cmaxabs * 0.001 * epsilon;

         if(cuseeps < epsilon)
            cuseeps = epsilon;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI01 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI02 removing value {}\n", cupd[i]);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(x < minStability && sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(-x < minStability && -sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel > max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }
   else if(val < -epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);


         // phase 1:
         minDelta
         (
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         minDelta
         (
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(infinity);
         ruseeps = rmaxabs * epsilon * 0.001;
         cuseeps = cmaxabs * epsilon * 0.001;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI03 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI04 removing value {}\n", x);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(x < minStability && -sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(-x < minStability && sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel < max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }

   assert(max * val >= 0);
   assert(enterId.type() != SPxId::INVALID);

   val = sel;

   return enterId;
}